

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::NewFrame(void)

{
  ImDrawListFlags *pIVar1;
  ImGuiNavMoveResult *pIVar2;
  bool *pbVar3;
  int *piVar4;
  ImVec2 *pIVar5;
  double dVar6;
  undefined8 uVar7;
  ImGuiID IVar8;
  ImGuiID IVar9;
  ImGuiInputSource IVar10;
  ImGuiContextHook *pIVar11;
  char *pcVar12;
  uint *puVar13;
  ImGuiViewportP *pIVar14;
  ImGuiWindow **ppIVar15;
  ImGuiPopupData *pIVar16;
  int *piVar17;
  ImGuiGroupData *pIVar18;
  ImVec2 IVar19;
  undefined1 auVar20 [12];
  ImGuiContext *pIVar21;
  ImGuiContext *pIVar22;
  ImGuiContext *pIVar23;
  ulong uVar24;
  byte bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  int iVar29;
  ImGuiContext *g_8;
  uint *__dest;
  ImGuiWindow *pIVar30;
  ImGuiWindow **__dest_00;
  ImGuiPopupData *__dest_01;
  int *piVar31;
  ImGuiGroupData *__dest_02;
  undefined4 uVar32;
  ImGuiContext *g_6;
  ImGuiContext *pIVar33;
  ImGuiWindow *pIVar34;
  ImGuiWindow *window;
  ImRect *pIVar35;
  ImGuiContext *g;
  int iVar36;
  float *pfVar37;
  ImGuiNavLayer IVar38;
  ImFont *font;
  float *pfVar39;
  ImGuiWindow *old_nav_window;
  long lVar40;
  ImGuiContext *g_2;
  byte bVar41;
  ImGuiContext *g_1;
  long lVar42;
  ImGuiNavMoveResult *pIVar43;
  uint uVar44;
  ImGuiContext *g_7;
  long lVar45;
  ulong uVar46;
  bool bVar47;
  uint uVar48;
  uint uVar49;
  uint uVar50;
  float fVar51;
  float fVar52;
  ImVec2 IVar53;
  ImVec2 IVar54;
  ImVec2 IVar55;
  undefined8 extraout_XMM0_Qb;
  ImVec4 IVar56;
  ImVec4 IVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  float fVar60;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  undefined1 auVar70 [16];
  float fVar71;
  undefined1 auVar72 [16];
  ImRect local_68;
  undefined4 local_4c;
  long local_48;
  long local_40;
  ulong local_38;
  
  pIVar21 = GImGui;
  bVar41 = 0;
  lVar42 = (long)(GImGui->Hooks).Size;
  if (0 < lVar42) {
    lVar45 = -lVar42;
    lVar40 = lVar42 + 1;
    lVar42 = lVar42 * 0x20;
    do {
      pIVar11 = (pIVar21->Hooks).Data;
      if (*(int *)(pIVar11 + lVar42 + -0x1c) == 7) {
        memmove(pIVar11 + lVar42 + -0x20,pIVar11 + lVar42,((pIVar21->Hooks).Size + lVar45) * 0x20);
        (pIVar21->Hooks).Size = (pIVar21->Hooks).Size + -1;
      }
      lVar45 = lVar45 + 1;
      lVar40 = lVar40 + -1;
      lVar42 = lVar42 + -0x20;
    } while (1 < lVar40);
  }
  if (0 < (pIVar21->Hooks).Size) {
    lVar42 = 0;
    lVar40 = 0;
    do {
      pIVar11 = (pIVar21->Hooks).Data;
      if (*(int *)(pIVar11 + lVar42 + 4) == 0) {
        (**(code **)(pIVar11 + lVar42 + 0x10))(pIVar21);
      }
      lVar40 = lVar40 + 1;
      lVar42 = lVar42 + 0x20;
    } while (lVar40 < (pIVar21->Hooks).Size);
  }
  pIVar22 = GImGui;
  if (((GImGui->IO).ConfigWindowsResizeFromEdges == true) && (((GImGui->IO).BackendFlags & 2) == 0))
  {
    (GImGui->IO).ConfigWindowsResizeFromEdges = false;
  }
  if (pIVar22->SettingsLoaded == false) {
    pcVar12 = (pIVar22->IO).IniFilename;
    if (pcVar12 != (char *)0x0) {
      LoadIniSettingsFromDisk(pcVar12);
    }
    pIVar22->SettingsLoaded = true;
  }
  if ((0.0 < pIVar22->SettingsDirtyTimer) &&
     (fVar51 = pIVar22->SettingsDirtyTimer - (pIVar22->IO).DeltaTime,
     pIVar22->SettingsDirtyTimer = fVar51, fVar51 <= 0.0)) {
    pcVar12 = (pIVar22->IO).IniFilename;
    if (pcVar12 == (char *)0x0) {
      (pIVar22->IO).WantSaveIniSettings = true;
    }
    else {
      SaveIniSettingsToDisk(pcVar12);
    }
    pIVar22->SettingsDirtyTimer = 0.0;
  }
  pIVar21->Time = (double)(pIVar21->IO).DeltaTime + pIVar21->Time;
  pIVar21->WithinFrameScope = true;
  pIVar21->FrameCount = pIVar21->FrameCount + 1;
  pIVar21->TooltipOverrideCount = 0;
  pIVar21->WindowsActiveCount = 0;
  iVar36 = (pIVar21->MenusIdSubmittedThisFrame).Capacity;
  if (iVar36 < 0) {
    uVar44 = iVar36 / 2 + iVar36;
    if ((int)uVar44 < 1) {
      uVar44 = 0;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar17 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar17 = *piVar17 + 1;
    }
    __dest = (uint *)(*GImAllocatorAllocFunc)((ulong)uVar44 * 4,GImAllocatorUserData);
    puVar13 = (pIVar21->MenusIdSubmittedThisFrame).Data;
    if (puVar13 != (uint *)0x0) {
      memcpy(__dest,puVar13,(long)(pIVar21->MenusIdSubmittedThisFrame).Size << 2);
      puVar13 = (pIVar21->MenusIdSubmittedThisFrame).Data;
      if ((puVar13 != (uint *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar17 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar17 = *piVar17 + -1;
      }
      (*GImAllocatorFreeFunc)(puVar13,GImAllocatorUserData);
    }
    (pIVar21->MenusIdSubmittedThisFrame).Data = __dest;
    (pIVar21->MenusIdSubmittedThisFrame).Capacity = uVar44;
  }
  (pIVar21->MenusIdSubmittedThisFrame).Size = 0;
  fVar51 = (pIVar21->IO).DeltaTime;
  iVar36 = pIVar21->FramerateSecPerFrameIdx;
  pIVar21->FramerateSecPerFrameAccum =
       (fVar51 - pIVar21->FramerateSecPerFrame[iVar36]) + pIVar21->FramerateSecPerFrameAccum;
  pIVar21->FramerateSecPerFrame[iVar36] = fVar51;
  iVar29 = iVar36 + (int)((ulong)((long)(iVar36 + 1) * -0x77777777) >> 0x20) + 1;
  pIVar21->FramerateSecPerFrameIdx = iVar36 + 1 + ((iVar29 >> 6) - (iVar29 >> 0x1f)) * -0x78;
  uVar44 = -(uint)(0.0 < pIVar21->FramerateSecPerFrameAccum);
  (pIVar21->IO).Framerate =
       (float)(~uVar44 & 0x7f7fffff |
              (uint)(1.0 / (pIVar21->FramerateSecPerFrameAccum / 120.0)) & uVar44);
  pIVar22 = GImGui;
  pIVar14 = *(GImGui->Viewports).Data;
  (pIVar14->super_ImGuiViewport).Flags = 5;
  (pIVar14->super_ImGuiViewport).Pos.x = 0.0;
  (pIVar14->super_ImGuiViewport).Pos.y = 0.0;
  (pIVar14->super_ImGuiViewport).Size = (pIVar22->IO).DisplaySize;
  if (0 < (pIVar22->Viewports).Size) {
    lVar42 = 0;
    do {
      pIVar14 = (pIVar22->Viewports).Data[lVar42];
      pIVar14->WorkOffsetMin = pIVar14->CurrWorkOffsetMin;
      pIVar14->WorkOffsetMax = pIVar14->CurrWorkOffsetMax;
      (pIVar14->CurrWorkOffsetMin).x = 0.0;
      (pIVar14->CurrWorkOffsetMin).y = 0.0;
      (pIVar14->CurrWorkOffsetMax).x = 0.0;
      (pIVar14->CurrWorkOffsetMax).y = 0.0;
      ImGuiViewportP::UpdateWorkRect(pIVar14);
      lVar42 = lVar42 + 1;
    } while (lVar42 < (pIVar22->Viewports).Size);
  }
  ((pIVar21->IO).Fonts)->Locked = true;
  font = (GImGui->IO).FontDefault;
  if (font == (ImFont *)0x0) {
    font = *(((GImGui->IO).Fonts)->Fonts).Data;
  }
  SetCurrentFont(font);
  lVar42 = (long)(pIVar21->Viewports).Size;
  IVar56 = _DAT_00167000;
  if (0 < lVar42) {
    lVar40 = 0;
    auVar20._4_8_ = extraout_XMM0_Qb;
    auVar20._0_4_ = DAT_00167000._4_4_;
    IVar56._0_8_ = auVar20._0_8_ << 0x20;
    IVar56.z = DAT_00167000._8_4_;
    IVar56.w = DAT_00167000._12_4_;
    IVar57 = _DAT_00167000;
    do {
      pIVar14 = (pIVar21->Viewports).Data[lVar40];
      IVar53 = (pIVar14->super_ImGuiViewport).Pos;
      IVar54 = (pIVar14->super_ImGuiViewport).Size;
      fVar51 = IVar53.x;
      fVar65 = IVar54.x + fVar51;
      fVar52 = IVar53.y;
      fVar66 = IVar54.y + fVar52;
      uVar44 = -(uint)(fVar51 < IVar57.x);
      uVar48 = -(uint)(fVar52 < IVar57.y);
      uVar49 = -(uint)(IVar56.z < fVar65);
      uVar50 = -(uint)(IVar56.w < fVar66);
      auVar61._0_4_ = (uint)fVar51 & uVar44;
      auVar61._4_4_ = (uint)fVar52 & uVar48;
      auVar61._8_4_ = (uint)fVar65 & uVar49;
      auVar61._12_4_ = (uint)fVar66 & uVar50;
      auVar63._0_4_ = ~uVar44 & (uint)IVar57.x;
      auVar63._4_4_ = ~uVar48 & (uint)IVar57.y;
      auVar63._8_4_ = ~uVar49 & (uint)IVar57.z;
      auVar63._12_4_ = ~uVar50 & (uint)IVar57.w;
      IVar56 = (ImVec4)(auVar63 | auVar61);
      lVar40 = lVar40 + 1;
      IVar57 = IVar56;
    } while (lVar42 != lVar40);
  }
  (pIVar21->DrawListSharedData).ClipRectFullscreen = IVar56;
  fVar51 = (pIVar21->Style).CircleSegmentMaxError;
  (pIVar21->DrawListSharedData).CurveTessellationTol = (pIVar21->Style).CurveTessellationTol;
  ImDrawListSharedData::SetCircleSegmentMaxError(&pIVar21->DrawListSharedData,fVar51);
  uVar44 = (uint)(pIVar21->Style).AntiAliasedLines;
  (pIVar21->DrawListSharedData).InitialFlags = uVar44;
  if (((pIVar21->Style).AntiAliasedLinesUseTex != false) &&
     ((pIVar21->Font->ContainerAtlas->Flags & 4) == 0)) {
    (pIVar21->DrawListSharedData).InitialFlags = uVar44 | 2;
  }
  if ((pIVar21->Style).AntiAliasedFill == true) {
    pIVar1 = &(pIVar21->DrawListSharedData).InitialFlags;
    *(byte *)pIVar1 = (byte)*pIVar1 | 4;
  }
  if (((pIVar21->IO).BackendFlags & 8) != 0) {
    pIVar1 = &(pIVar21->DrawListSharedData).InitialFlags;
    *(byte *)pIVar1 = (byte)*pIVar1 | 8;
  }
  if (0 < (pIVar21->Viewports).Size) {
    lVar42 = 0;
    do {
      pIVar14 = (pIVar21->Viewports).Data[lVar42];
      (pIVar14->DrawDataP).DisplaySize.x = 0.0;
      (pIVar14->DrawDataP).DisplaySize.y = 0.0;
      (pIVar14->DrawDataP).FramebufferScale.x = 0.0;
      (pIVar14->DrawDataP).FramebufferScale.y = 0.0;
      (pIVar14->DrawDataP).CmdLists = (ImDrawList **)0x0;
      (pIVar14->DrawDataP).DisplayPos.x = 0.0;
      (pIVar14->DrawDataP).DisplayPos.y = 0.0;
      (pIVar14->DrawDataP).Valid = false;
      *(undefined3 *)&(pIVar14->DrawDataP).field_0x1 = 0;
      (pIVar14->DrawDataP).CmdListsCount = 0;
      (pIVar14->DrawDataP).TotalIdxCount = 0;
      (pIVar14->DrawDataP).TotalVtxCount = 0;
      lVar42 = lVar42 + 1;
    } while (lVar42 < (pIVar21->Viewports).Size);
  }
  pIVar22 = GImGui;
  if ((pIVar21->DragDropActive != false) &&
     (IVar8 = (pIVar21->DragDropPayload).SourceId, IVar8 == pIVar21->ActiveId)) {
    if (GImGui->ActiveId == IVar8) {
      GImGui->ActiveIdIsAlive = IVar8;
    }
    if (pIVar22->ActiveIdPreviousFrame == IVar8) {
      pIVar22->ActiveIdPreviousFrameIsAlive = true;
    }
  }
  if (pIVar21->HoveredIdPreviousFrame == 0) {
    pIVar21->HoveredIdTimer = 0.0;
LAB_0011ac9d:
    pIVar21->HoveredIdNotActiveTimer = 0.0;
  }
  else if ((pIVar21->HoveredId != 0) && (pIVar21->ActiveId == pIVar21->HoveredId))
  goto LAB_0011ac9d;
  IVar8 = pIVar21->HoveredId;
  if ((IVar8 != 0) &&
     (pIVar21->HoveredIdTimer = (pIVar21->IO).DeltaTime + pIVar21->HoveredIdTimer,
     pIVar21->ActiveId != IVar8)) {
    pIVar21->HoveredIdNotActiveTimer = (pIVar21->IO).DeltaTime + pIVar21->HoveredIdNotActiveTimer;
  }
  pIVar21->HoveredIdPreviousFrame = IVar8;
  pIVar21->HoveredIdPreviousFrameUsingMouseWheel = pIVar21->HoveredIdUsingMouseWheel;
  pIVar21->HoveredId = 0;
  pIVar21->HoveredIdAllowOverlap = false;
  pIVar21->HoveredIdUsingMouseWheel = false;
  pIVar21->HoveredIdDisabled = false;
  IVar8 = pIVar21->ActiveId;
  if (((pIVar21->ActiveIdIsAlive != IVar8) && (IVar8 != 0)) &&
     (pIVar21->ActiveIdPreviousFrame == IVar8)) {
    SetActiveID(0,(ImGuiWindow *)0x0);
  }
  IVar8 = pIVar21->ActiveId;
  if (IVar8 != 0) {
    pIVar21->ActiveIdTimer = (pIVar21->IO).DeltaTime + pIVar21->ActiveIdTimer;
  }
  pIVar21->LastActiveIdTimer = (pIVar21->IO).DeltaTime + pIVar21->LastActiveIdTimer;
  pIVar21->ActiveIdPreviousFrame = IVar8;
  pIVar21->ActiveIdPreviousFrameWindow = pIVar21->ActiveIdWindow;
  pIVar21->ActiveIdPreviousFrameHasBeenEditedBefore = pIVar21->ActiveIdHasBeenEditedBefore;
  pIVar21->ActiveIdIsAlive = 0;
  pIVar21->ActiveIdHasBeenEditedThisFrame = false;
  pIVar21->ActiveIdPreviousFrameIsAlive = false;
  pIVar21->ActiveIdIsJustActivated = false;
  if (IVar8 != pIVar21->TempInputId && pIVar21->TempInputId != 0) {
    pIVar21->TempInputId = 0;
  }
  if (IVar8 == 0) {
    pIVar21->ActiveIdUsingNavDirMask = 0;
    pIVar21->ActiveIdUsingNavInputMask = 0;
    pIVar21->ActiveIdUsingKeyInputMask = 0;
  }
  pIVar21->DragDropAcceptIdPrev = pIVar21->DragDropAcceptIdCurr;
  pIVar21->DragDropAcceptIdCurrRectSurface = 3.4028235e+38;
  pIVar21->DragDropAcceptIdCurr = 0;
  pIVar21->DragDropWithinSource = false;
  pIVar21->DragDropWithinTarget = false;
  pIVar21->DragDropHoldJustPressedId = 0;
  pIVar22 = GImGui;
  bVar47 = (GImGui->IO).KeyCtrl;
  uVar44 = bVar47 + 2;
  if ((GImGui->IO).KeyShift == false) {
    uVar44 = (uint)bVar47;
  }
  uVar48 = uVar44 + 4;
  if ((GImGui->IO).KeyAlt == false) {
    uVar48 = uVar44;
  }
  uVar44 = uVar48 + 8;
  if ((GImGui->IO).KeySuper == false) {
    uVar44 = uVar48;
  }
  (pIVar21->IO).KeyMods = uVar44;
  memcpy((pIVar21->IO).KeysDownDurationPrev,(pIVar21->IO).KeysDownDuration,0x800);
  lVar42 = 0x144;
  do {
    fVar51 = -1.0;
    if (*(char *)((long)(pIVar21->IO).KeyMap + lVar42 + -0x3c) == '\x01') {
      fVar52 = *(float *)((long)pIVar21 + lVar42 * 4 + -0x70);
      fVar51 = 0.0;
      if (0.0 <= fVar52) {
        fVar51 = fVar52 + (pIVar21->IO).DeltaTime;
      }
    }
    *(float *)((long)pIVar21 + lVar42 * 4 + -0x70) = fVar51;
    lVar42 = lVar42 + 1;
  } while (lVar42 != 0x344);
  (pIVar22->IO).WantSetMousePos = false;
  pIVar22->NavWrapRequestWindow = (ImGuiWindow *)0x0;
  pIVar22->NavWrapRequestFlags = 0;
  uVar44 = (pIVar22->IO).ConfigFlags;
  if ((uVar44 & 2) == 0) {
    bVar25 = 0;
  }
  else {
    bVar25 = (byte)(pIVar22->IO).BackendFlags & 1;
  }
  if (((bVar25 != 0) && (pIVar22->NavInputSource != ImGuiInputSource_NavGamepad)) &&
     ((((0.0 < (pIVar22->IO).NavInputs[0] ||
        ((0.0 < (pIVar22->IO).NavInputs[2] || (0.0 < (pIVar22->IO).NavInputs[1])))) ||
       (0.0 < (pIVar22->IO).NavInputs[3])) ||
      ((((0.0 < (pIVar22->IO).NavInputs[4] || (0.0 < (pIVar22->IO).NavInputs[5])) ||
        (0.0 < (pIVar22->IO).NavInputs[6])) || (0.0 < (pIVar22->IO).NavInputs[7])))))) {
    pIVar22->NavInputSource = ImGuiInputSource_NavGamepad;
  }
  if ((uVar44 & 1) != 0) {
    lVar42 = (long)(pIVar22->IO).KeyMap[0xc];
    if ((-1 < lVar42) && ((pIVar22->IO).KeysDown[lVar42] == true)) {
      (pIVar22->IO).NavInputs[0] = 1.0;
      pIVar22->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    lVar42 = (long)(pIVar22->IO).KeyMap[0xd];
    if ((-1 < lVar42) && ((pIVar22->IO).KeysDown[lVar42] == true)) {
      (pIVar22->IO).NavInputs[2] = 1.0;
      pIVar22->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    lVar42 = (long)(pIVar22->IO).KeyMap[0xe];
    if ((-1 < lVar42) && ((pIVar22->IO).KeysDown[lVar42] == true)) {
      (pIVar22->IO).NavInputs[1] = 1.0;
      pIVar22->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    lVar42 = (long)(pIVar22->IO).KeyMap[1];
    if ((-1 < lVar42) && ((pIVar22->IO).KeysDown[lVar42] == true)) {
      (pIVar22->IO).NavInputs[0x11] = 1.0;
      pIVar22->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    lVar42 = (long)(pIVar22->IO).KeyMap[2];
    if ((-1 < lVar42) && ((pIVar22->IO).KeysDown[lVar42] == true)) {
      (pIVar22->IO).NavInputs[0x12] = 1.0;
      pIVar22->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    lVar42 = (long)(pIVar22->IO).KeyMap[3];
    if ((-1 < lVar42) && ((pIVar22->IO).KeysDown[lVar42] == true)) {
      (pIVar22->IO).NavInputs[0x13] = 1.0;
      pIVar22->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    lVar42 = (long)(pIVar22->IO).KeyMap[4];
    if ((-1 < lVar42) && ((pIVar22->IO).KeysDown[lVar42] == true)) {
      (pIVar22->IO).NavInputs[0x14] = 1.0;
      pIVar22->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar47 = (pIVar22->IO).KeyCtrl;
    if (bVar47 == true) {
      (pIVar22->IO).NavInputs[0xe] = 1.0;
    }
    if ((pIVar22->IO).KeyShift == true) {
      (pIVar22->IO).NavInputs[0xf] = 1.0;
    }
    if ((bVar47 == false) && ((pIVar22->IO).KeyAlt != false)) {
      (pIVar22->IO).NavInputs[0x10] = 1.0;
    }
  }
  pfVar37 = (pIVar22->IO).NavInputsDownDuration;
  pfVar39 = (pIVar22->IO).NavInputsDownDurationPrev;
  for (lVar42 = 0x15; lVar42 != 0; lVar42 = lVar42 + -1) {
    *pfVar39 = *pfVar37;
    pfVar37 = pfVar37 + (ulong)bVar41 * -2 + 1;
    pfVar39 = pfVar39 + (ulong)bVar41 * -2 + 1;
  }
  lVar42 = 0x528;
  do {
    fVar51 = -1.0;
    if (0.0 < *(float *)((long)pIVar22 + lVar42 * 4 + -0x115c)) {
      fVar52 = (float)(pIVar22->IO).KeyMap[lVar42 + -0xf];
      fVar51 = 0.0;
      if (0.0 <= fVar52) {
        fVar51 = fVar52 + (pIVar22->IO).DeltaTime;
      }
    }
    (pIVar22->IO).KeyMap[lVar42 + -0xf] = (int)fVar51;
    lVar42 = lVar42 + 1;
  } while (lVar42 != 0x53d);
  IVar8 = pIVar22->NavInitResultId;
  if ((IVar8 != 0) &&
     (((pIVar22->NavDisableHighlight != true || (pIVar22->NavInitRequestFromMove == true)) &&
      (pIVar30 = pIVar22->NavWindow, pIVar30 != (ImGuiWindow *)0x0)))) {
    IVar38 = pIVar22->NavLayer;
    if (pIVar22->NavInitRequestFromMove == true) {
      pIVar22->NavId = IVar8;
      pIVar22->NavFocusScopeId = 0;
      pIVar30->NavLastIds[(int)IVar38] = IVar8;
      IVar53 = (pIVar22->NavInitResultRectRel).Max;
      pIVar30->NavRectRel[(int)IVar38].Min = (pIVar22->NavInitResultRectRel).Min;
      (&pIVar30->NavRectRel[(int)IVar38].Min)[1] = IVar53;
      pIVar22->NavMousePosDirty = true;
      pIVar22->NavDisableHighlight = false;
      pIVar22->NavDisableMouseHover = true;
    }
    else {
      pIVar22->NavId = IVar8;
      pIVar22->NavFocusScopeId = 0;
      pIVar30->NavLastIds[(int)IVar38] = IVar8;
    }
    IVar53 = (pIVar22->NavInitResultRectRel).Max;
    pIVar5 = &pIVar22->NavWindow->NavRectRel[pIVar22->NavLayer].Min;
    *pIVar5 = (pIVar22->NavInitResultRectRel).Min;
    pIVar5[1] = IVar53;
  }
  pIVar22->NavInitRequest = false;
  pIVar22->NavInitRequestFromMove = false;
  pIVar22->NavInitResultId = 0;
  pIVar22->NavJustMovedToId = 0;
  if (pIVar22->NavMoveRequest == true) {
    IVar8 = (pIVar22->NavMoveResultLocal).ID;
    if ((IVar8 == 0) && ((pIVar22->NavMoveResultOther).ID == 0)) {
      pIVar33 = pIVar22;
      if (pIVar22->NavId == 0) goto LAB_0011b3d5;
    }
    else {
      pIVar2 = &pIVar22->NavMoveResultOther;
      pIVar43 = &pIVar22->NavMoveResultLocal;
      if (IVar8 == 0) {
        pIVar43 = pIVar2;
      }
      if ((((pIVar22->NavMoveRequestFlags & 0x20U) != 0) &&
          (IVar8 = (pIVar22->NavMoveResultLocalVisibleSet).ID, IVar8 != 0)) &&
         (IVar8 != pIVar22->NavId)) {
        pIVar43 = &pIVar22->NavMoveResultLocalVisibleSet;
      }
      if (((pIVar43 != pIVar2) && ((pIVar22->NavMoveResultOther).ID != 0)) &&
         (((pIVar22->NavMoveResultOther).Window)->ParentWindow == pIVar22->NavWindow)) {
        fVar51 = (pIVar22->NavMoveResultOther).DistBox;
        fVar52 = pIVar43->DistBox;
        if (fVar52 <= fVar51) {
          if (((fVar51 != fVar52) || (NAN(fVar51) || NAN(fVar52))) ||
             (pfVar37 = &(pIVar22->NavMoveResultOther).DistCenter,
             pIVar43->DistCenter < *pfVar37 || pIVar43->DistCenter == *pfVar37)) goto LAB_0011b2c2;
        }
        pIVar43 = pIVar2;
      }
LAB_0011b2c2:
      if (pIVar22->NavLayer == ImGuiNavLayer_Main) {
        if ((pIVar22->NavMoveRequestFlags & 0x40U) == 0) {
          IVar53 = pIVar43->Window->Pos;
          IVar54 = (pIVar43->RectRel).Min;
          fVar51 = IVar53.x;
          local_68.Min.x = IVar54.x + fVar51;
          fVar52 = IVar53.y;
          local_68.Min.y = IVar54.y + fVar52;
          IVar53 = (pIVar43->RectRel).Max;
          local_68.Max.x = IVar53.x + fVar51;
          local_68.Max.y = IVar53.y + fVar52;
          IVar53 = ScrollToBringRectIntoView(pIVar43->Window,&local_68);
        }
        else {
          fVar51 = 0.0;
          if (pIVar22->NavMoveDir == 2) {
            fVar51 = (pIVar43->Window->ScrollMax).y;
          }
          pIVar30 = pIVar43->Window;
          IVar53 = (ImVec2)((ulong)(uint)((pIVar30->Scroll).y - fVar51) << 0x20);
          (pIVar30->ScrollTarget).y = fVar51;
          (pIVar30->ScrollTargetCenterRatio).y = 0.0;
          (pIVar30->ScrollTargetEdgeSnapDist).y = 0.0;
        }
        fVar51 = (pIVar43->RectRel).Min.y;
        fVar52 = (pIVar43->RectRel).Max.x;
        fVar65 = (pIVar43->RectRel).Max.y;
        (pIVar43->RectRel).Min.x = (pIVar43->RectRel).Min.x - IVar53.x;
        (pIVar43->RectRel).Min.y = fVar51 - IVar53.y;
        (pIVar43->RectRel).Max.x = fVar52 - IVar53.x;
        (pIVar43->RectRel).Max.y = fVar65 - IVar53.y;
      }
      SetActiveID(0,(ImGuiWindow *)0x0);
      pIVar22->NavWindow = pIVar43->Window;
      IVar8 = pIVar43->ID;
      if (pIVar22->NavId != IVar8) {
        pIVar22->NavJustMovedToId = IVar8;
        pIVar22->NavJustMovedToFocusScopeId = pIVar43->FocusScopeId;
        pIVar22->NavJustMovedToKeyMods = pIVar22->NavMoveRequestKeyMods;
      }
      pIVar33 = GImGui;
      IVar38 = pIVar22->NavLayer;
      IVar9 = pIVar43->FocusScopeId;
      GImGui->NavId = IVar8;
      pIVar33->NavFocusScopeId = IVar9;
      pIVar30 = pIVar33->NavWindow;
      pIVar30->NavLastIds[(int)IVar38] = IVar8;
      IVar53 = (pIVar43->RectRel).Max;
      pIVar5 = &pIVar30->NavRectRel[(int)IVar38].Min;
      *pIVar5 = (pIVar43->RectRel).Min;
      pIVar5[1] = IVar53;
      pIVar33->NavMousePosDirty = true;
    }
    pIVar33->NavDisableHighlight = false;
    pIVar33->NavDisableMouseHover = true;
  }
LAB_0011b3d5:
  if (pIVar22->NavMoveRequestForward == ImGuiNavForward_ForwardActive) {
    if (((pIVar22->NavMoveResultLocal).ID == 0) && ((pIVar22->NavMoveResultOther).ID == 0)) {
      pIVar22->NavDisableHighlight = false;
    }
    pIVar22->NavMoveRequestForward = ImGuiNavForward_None;
  }
  if ((pIVar22->NavMousePosDirty == true) && (pIVar22->NavIdIsAlive == true)) {
    if ((((pIVar22->IO).ConfigFlags & 4) != 0) &&
       ((((((pIVar22->IO).BackendFlags & 4) != 0 && (pIVar22->NavDisableHighlight == false)) &&
         (pIVar22->NavDisableMouseHover == true)) && (pIVar22->NavWindow != (ImGuiWindow *)0x0)))) {
      IVar53 = NavCalcPreferredRefPos();
      (pIVar22->IO).MousePosPrev = IVar53;
      (pIVar22->IO).MousePos = IVar53;
      (pIVar22->IO).WantSetMousePos = true;
    }
    pIVar22->NavMousePosDirty = false;
  }
  pIVar22->NavIdIsAlive = false;
  pIVar22->NavJustTabbedId = 0;
  pIVar30 = pIVar22->NavWindow;
  pIVar34 = pIVar30;
  if (pIVar30 != (ImGuiWindow *)0x0) {
    do {
      if ((pIVar34->Flags & 0x15000000U) != 0x1000000) {
        if (pIVar34 != pIVar30) {
          pIVar34->NavLastChildNavWindow = pIVar30;
        }
        break;
      }
      ppIVar15 = &pIVar34->ParentWindow;
      pIVar34 = *ppIVar15;
    } while (*ppIVar15 != (ImGuiWindow *)0x0);
    if (((pIVar30 != (ImGuiWindow *)0x0) && (pIVar30->NavLastChildNavWindow != (ImGuiWindow *)0x0))
       && (pIVar22->NavLayer == ImGuiNavLayer_Main)) {
      pIVar30->NavLastChildNavWindow = (ImGuiWindow *)0x0;
    }
  }
  pIVar33 = GImGui;
  pIVar30 = GetTopMostPopupModal();
  if (pIVar30 != (ImGuiWindow *)0x0) {
    pIVar33->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if ((pIVar33->NavWindowingTargetAnim != (ImGuiWindow *)0x0) &&
     (pIVar33->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    fVar51 = (pIVar33->IO).DeltaTime * -10.0 + pIVar33->NavWindowingHighlightAlpha;
    fVar51 = (float)(-(uint)(0.0 <= fVar51) & (uint)fVar51);
    pIVar33->NavWindowingHighlightAlpha = fVar51;
    if ((pIVar33->DimBgRatio <= 0.0) && (fVar51 <= 0.0)) {
      pIVar33->NavWindowingTargetAnim = (ImGuiWindow *)0x0;
    }
  }
  if ((pIVar30 == (ImGuiWindow *)0x0) && (pIVar33->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    bVar47 = (pIVar33->IO).NavInputsDownDuration[3] == 0.0;
  }
  else {
    bVar47 = false;
  }
  if ((((pIVar30 == (ImGuiWindow *)0x0) && (pIVar33->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
      ((pIVar33->IO).KeyCtrl == true)) &&
     ((iVar36 = (pIVar33->IO).KeyMap[0], -1 < iVar36 && (bVar26 = IsKeyPressed(iVar36,true), bVar26)
      ))) {
    bVar41 = (byte)(pIVar33->IO).ConfigFlags & 1;
  }
  else {
    bVar41 = 0;
  }
  if (bVar47 || bVar41 != 0) {
    pIVar30 = pIVar33->NavWindow;
    if (pIVar30 == (ImGuiWindow *)0x0) {
      pIVar30 = FindWindowNavFocusable((pIVar33->WindowsFocusOrder).Size + -1,-0x7fffffff,-1);
    }
    if (pIVar30 != (ImGuiWindow *)0x0) {
      pIVar30 = pIVar30->RootWindow;
      pIVar33->NavWindowingTargetAnim = pIVar30;
      pIVar33->NavWindowingTarget = pIVar30;
      pIVar33->NavWindowingTimer = 0.0;
      pIVar33->NavWindowingHighlightAlpha = 0.0;
      pIVar33->NavWindowingToggleLayer = (bool)(bVar41 ^ 1);
      pIVar33->NavInputSource = ImGuiInputSource_NavGamepad - bVar41;
    }
  }
  fVar51 = (pIVar33->IO).DeltaTime + pIVar33->NavWindowingTimer;
  pIVar33->NavWindowingTimer = fVar51;
  if ((pIVar33->NavWindowingTarget == (ImGuiWindow *)0x0) ||
     (pIVar33->NavInputSource != ImGuiInputSource_NavGamepad)) {
LAB_0011b6f9:
    bVar47 = false;
    pIVar30 = (ImGuiWindow *)0x0;
  }
  else {
    fVar52 = (fVar51 + -0.2) / 0.05;
    fVar51 = 1.0;
    if (fVar52 <= 1.0) {
      fVar51 = fVar52;
    }
    fVar51 = (float)(~-(uint)(fVar52 < 0.0) & (uint)fVar51);
    uVar48 = -(uint)(fVar51 <= pIVar33->NavWindowingHighlightAlpha);
    pIVar33->NavWindowingHighlightAlpha =
         (float)(uVar48 & (uint)pIVar33->NavWindowingHighlightAlpha | ~uVar48 & (uint)fVar51);
    fVar51 = GetNavInputAmount(0xc,ImGuiInputReadMode_RepeatSlow);
    fVar52 = GetNavInputAmount(0xd,ImGuiInputReadMode_RepeatSlow);
    iVar36 = (uint)(0.0 < fVar51) - (uint)(0.0 < fVar52);
    if (iVar36 != 0) {
      NavUpdateWindowingHighlightWindow(iVar36);
      pIVar33->NavWindowingHighlightAlpha = 1.0;
    }
    if (0.0 < (GImGui->IO).NavInputs[3]) goto LAB_0011b6f9;
    pbVar3 = &pIVar33->NavWindowingToggleLayer;
    *pbVar3 = (bool)(*pbVar3 &
                    (pIVar33->NavWindowingHighlightAlpha <= 1.0 &&
                    pIVar33->NavWindowingHighlightAlpha != 1.0));
    if (*pbVar3 == false) {
      pIVar30 = pIVar33->NavWindowingTarget;
      bVar47 = false;
    }
    else {
      bVar47 = pIVar33->NavWindow != (ImGuiWindow *)0x0;
      pIVar30 = (ImGuiWindow *)0x0;
    }
    pIVar33->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if ((pIVar33->NavWindowingTarget != (ImGuiWindow *)0x0) &&
     (pIVar33->NavInputSource == ImGuiInputSource_NavKeyboard)) {
    fVar52 = (pIVar33->NavWindowingTimer + -0.2) / 0.05;
    fVar51 = 1.0;
    if (fVar52 <= 1.0) {
      fVar51 = fVar52;
    }
    fVar51 = (float)(~-(uint)(fVar52 < 0.0) & (uint)fVar51);
    uVar48 = -(uint)(fVar51 <= pIVar33->NavWindowingHighlightAlpha);
    pIVar33->NavWindowingHighlightAlpha =
         (float)(uVar48 & (uint)pIVar33->NavWindowingHighlightAlpha | ~uVar48 & (uint)fVar51);
    iVar36 = (GImGui->IO).KeyMap[0];
    if ((-1 < iVar36) && (bVar26 = IsKeyPressed(iVar36,true), bVar26)) {
      NavUpdateWindowingHighlightWindow((pIVar33->IO).KeyShift - 1 | 1);
    }
    if ((pIVar33->IO).KeyCtrl == false) {
      pIVar30 = pIVar33->NavWindowingTarget;
    }
  }
  pIVar23 = GImGui;
  fVar51 = (GImGui->IO).NavInputsDownDuration[0x10];
  if ((fVar51 == 0.0) && (!NAN(fVar51))) {
    pIVar33->NavWindowingToggleLayer = true;
  }
  bVar26 = bVar47;
  if ((((pIVar33->ActiveId == 0) || (pIVar33->ActiveIdAllowOverlap == true)) && (fVar51 < 0.0)) &&
     (((pIVar33->NavWindowingToggleLayer != false &&
       (0.0 <= (pIVar23->IO).NavInputsDownDurationPrev[0x10])) &&
      (bVar26 = true,
      (-256000.0 <= (pIVar33->IO).MousePos.x && -256000.0 <= (pIVar33->IO).MousePos.y) !=
      (-256000.0 <= (pIVar33->IO).MousePosPrev.y && -256000.0 <= (pIVar33->IO).MousePosPrev.x))))) {
    bVar26 = bVar47;
  }
  pIVar34 = pIVar33->NavWindowingTarget;
  if ((pIVar34 != (ImGuiWindow *)0x0) && ((pIVar34->Flags & 4) == 0)) {
    IVar10 = pIVar33->NavInputSource;
    IVar53.x = 0.0;
    IVar53.y = 0.0;
    if ((IVar10 == ImGuiInputSource_NavKeyboard) && ((pIVar33->IO).KeyShift == false)) {
      IVar53 = GetNavInputAmount2d(1,ImGuiInputReadMode_Down,0.0,0.0);
    }
    if (IVar10 == ImGuiInputSource_NavGamepad) {
      IVar53 = GetNavInputAmount2d(4,ImGuiInputReadMode_Down,0.0,0.0);
    }
    fVar51 = IVar53.y;
    if (((IVar53.x != 0.0) || (fVar51 != 0.0)) || (NAN(fVar51))) {
      fVar52 = (pIVar33->IO).DisplayFramebufferScale.x;
      fVar65 = (pIVar33->IO).DisplayFramebufferScale.y;
      if (fVar65 <= fVar52) {
        fVar52 = fVar65;
      }
      fVar52 = (float)(int)(fVar52 * (pIVar33->IO).DeltaTime * 800.0);
      pIVar34 = pIVar34->RootWindow;
      local_68.Min.x = (pIVar34->Pos).x + IVar53.x * fVar52;
      local_68.Min.y = (pIVar34->Pos).y + fVar51 * fVar52;
      SetWindowPos(pIVar34,&local_68.Min,1);
      if (((pIVar34->Flags & 0x100) == 0) && (GImGui->SettingsDirtyTimer <= 0.0)) {
        GImGui->SettingsDirtyTimer = (GImGui->IO).IniSavingRate;
      }
      pIVar33->NavDisableMouseHover = true;
    }
  }
  if (pIVar30 != (ImGuiWindow *)0x0) {
    if ((pIVar33->NavWindow == (ImGuiWindow *)0x0) || (pIVar30 != pIVar33->NavWindow->RootWindow)) {
      SetActiveID(0,(ImGuiWindow *)0x0);
      pIVar33->NavDisableHighlight = false;
      pIVar33->NavDisableMouseHover = true;
      pIVar34 = pIVar30->NavLastChildNavWindow;
      if ((pIVar34 == (ImGuiWindow *)0x0) || (pIVar34->WasActive == false)) {
        pIVar34 = pIVar30;
      }
      ClosePopupsOverWindow(pIVar34,false);
      FocusWindow(pIVar34);
      if (pIVar34->NavLastIds[0] == 0) {
        NavInitWindow(pIVar34,false);
      }
      if ((pIVar34->DC).NavLayerActiveMask == 2) {
        pIVar33->NavLayer = ImGuiNavLayer_Menu;
      }
    }
    pIVar33->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if ((bVar26) && (pIVar30 = pIVar33->NavWindow, pIVar34 = pIVar30, pIVar30 != (ImGuiWindow *)0x0))
  {
    while (window = pIVar34, window->ParentWindow != (ImGuiWindow *)0x0) {
      if ((((window->DC).NavLayerActiveMask & 2) != 0) ||
         (pIVar34 = window->ParentWindow, (window->Flags & 0x15000000U) != 0x1000000)) break;
    }
    if (window != pIVar30) {
      FocusWindow(window);
      window->NavLastChildNavWindow = pIVar30;
    }
    pIVar33->NavDisableHighlight = false;
    pIVar33->NavDisableMouseHover = true;
    IVar38 = ImGuiNavLayer_Main;
    if (((pIVar33->NavWindow->DC).NavLayerActiveMask & 2) != 0) {
      IVar38 = pIVar33->NavLayer ^ ImGuiNavLayer_Menu;
    }
    NavRestoreLayer(IVar38);
  }
  if ((((uVar44 & 1) == 0 & (bVar25 ^ 1)) == 0) && (pIVar22->NavWindow != (ImGuiWindow *)0x0)) {
    bVar47 = (pIVar22->NavWindow->Flags & 0x40000U) == 0;
    (pIVar22->IO).NavActive = bVar47;
    if (((!bVar47) || (pIVar22->NavId == 0)) ||
       (bVar47 = true, pIVar22->NavDisableHighlight != false)) goto LAB_0011bae6;
  }
  else {
    (pIVar22->IO).NavActive = false;
LAB_0011bae6:
    bVar47 = pIVar22->NavWindowingTarget != (ImGuiWindow *)0x0;
  }
  (pIVar22->IO).NavVisible = bVar47;
  fVar51 = (GImGui->IO).NavInputsDownDuration[1];
  if ((fVar51 == 0.0) && (!NAN(fVar51))) {
    if (pIVar22->ActiveId == 0) {
      pIVar30 = pIVar22->NavWindow;
      if (((pIVar30 == (ImGuiWindow *)0x0) || ((pIVar30->Flags & 0x5000000U) != 0x1000000)) ||
         (pIVar30->ParentWindow == (ImGuiWindow *)0x0)) {
        iVar36 = (pIVar22->OpenPopupStack).Size;
        if ((long)iVar36 < 1) {
          if (pIVar22->NavLayer == ImGuiNavLayer_Main) {
            if ((pIVar30 != (ImGuiWindow *)0x0) && ((pIVar30->Flags & 0x5000000U) != 0x1000000)) {
              pIVar30->NavLastIds[0] = 0;
            }
            pIVar22->NavId = 0;
            pIVar22->NavFocusScopeId = 0;
          }
          else {
            NavRestoreLayer(ImGuiNavLayer_Main);
          }
        }
        else if ((((pIVar22->OpenPopupStack).Data[(long)iVar36 + -1].Window)->Flags & 0x8000000) ==
                 0) {
          ClosePopupToLevel(iVar36 + -1,true);
        }
      }
      else {
        FocusWindow(pIVar30->ParentWindow);
        pIVar33 = GImGui;
        IVar8 = pIVar30->ChildId;
        GImGui->NavId = IVar8;
        pIVar33->NavFocusScopeId = 0;
        pIVar33->NavWindow->NavLastIds[0] = IVar8;
        pIVar22->NavIdIsAlive = false;
        if (pIVar22->NavDisableMouseHover == true) {
          pIVar22->NavMousePosDirty = true;
        }
      }
    }
    else if ((GImGui->ActiveIdUsingNavInputMask & 2) == 0) {
      SetActiveID(0,(ImGuiWindow *)0x0);
    }
  }
  pIVar22->NavActivateId = 0;
  pIVar22->NavActivateDownId = 0;
  pIVar22->NavActivatePressedId = 0;
  pIVar33 = GImGui;
  pIVar22->NavInputId = 0;
  IVar8 = pIVar22->NavId;
  if ((((IVar8 != 0) && (pIVar22->NavDisableHighlight == false)) &&
      (pIVar22->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
     ((pIVar22->NavWindow != (ImGuiWindow *)0x0 && ((pIVar22->NavWindow->Flags & 0x40000) == 0)))) {
    fVar51 = (GImGui->IO).NavInputs[0];
    if (0.0 < fVar51) {
      bVar47 = (GImGui->IO).NavInputsDownDuration[0] == 0.0;
    }
    else {
      bVar47 = false;
    }
    IVar9 = pIVar22->ActiveId;
    if (bVar47 && IVar9 == 0) {
      pIVar22->NavActivateId = IVar8;
    }
    if (IVar9 == 0) {
      if (0.0 < fVar51) goto LAB_0011d3e2;
    }
    else if (IVar9 == IVar8 && 0.0 < fVar51) {
LAB_0011d3e2:
      pIVar22->NavActivateDownId = IVar8;
    }
    if (IVar9 == 0) {
      if (bVar47) goto LAB_0011d3f8;
    }
    else if ((bool)(bVar47 & IVar9 == IVar8)) {
LAB_0011d3f8:
      pIVar22->NavActivatePressedId = IVar8;
    }
    if (((IVar9 == 0 || IVar9 == IVar8) &&
        (fVar51 = (pIVar33->IO).NavInputsDownDuration[2], fVar51 == 0.0)) && (!NAN(fVar51))) {
      pIVar22->NavInputId = IVar8;
    }
  }
  pIVar30 = pIVar22->NavWindow;
  if ((pIVar30 != (ImGuiWindow *)0x0) && ((pIVar30->Flags & 0x40000) != 0)) {
    pIVar22->NavDisableHighlight = true;
  }
  pIVar22->NavMoveRequest = false;
  IVar9 = pIVar22->NavNextActivateId;
  if (IVar9 != 0) {
    pIVar22->NavActivateId = IVar9;
    pIVar22->NavActivateDownId = IVar9;
    pIVar22->NavActivatePressedId = IVar9;
    pIVar22->NavInputId = IVar9;
  }
  pIVar22->NavNextActivateId = 0;
  if (pIVar22->NavMoveRequestForward == ImGuiNavForward_None) {
    pIVar22->NavMoveDir = -1;
    pIVar22->NavMoveRequestFlags = 0;
    if (((pIVar30 != (ImGuiWindow *)0x0) && (pIVar22->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
       ((pIVar30->Flags & 0x40000) == 0)) {
      uVar48 = GImGui->ActiveIdUsingNavDirMask;
      if (((uVar48 & 1) == 0) &&
         ((fVar51 = GetNavInputAmount(4,ImGuiInputReadMode_Repeat), 0.0 < fVar51 ||
          (fVar51 = GetNavInputAmount(0x11,ImGuiInputReadMode_Repeat), 0.0 < fVar51)))) {
        pIVar22->NavMoveDir = 0;
      }
      if (((uVar48 & 2) == 0) &&
         ((fVar51 = GetNavInputAmount(5,ImGuiInputReadMode_Repeat), 0.0 < fVar51 ||
          (fVar51 = GetNavInputAmount(0x12,ImGuiInputReadMode_Repeat), 0.0 < fVar51)))) {
        pIVar22->NavMoveDir = 1;
      }
      if (((uVar48 & 4) == 0) &&
         ((fVar51 = GetNavInputAmount(6,ImGuiInputReadMode_Repeat), 0.0 < fVar51 ||
          (fVar51 = GetNavInputAmount(0x13,ImGuiInputReadMode_Repeat), 0.0 < fVar51)))) {
        pIVar22->NavMoveDir = 2;
      }
      if (((uVar48 & 8) == 0) &&
         ((fVar51 = GetNavInputAmount(7,ImGuiInputReadMode_Repeat), 0.0 < fVar51 ||
          (fVar51 = GetNavInputAmount(0x14,ImGuiInputReadMode_Repeat), 0.0 < fVar51)))) {
        pIVar22->NavMoveDir = 3;
      }
    }
    pIVar22->NavMoveClipDir = pIVar22->NavMoveDir;
  }
  else {
    pIVar22->NavMoveRequestForward = ImGuiNavForward_ForwardActive;
  }
  pIVar33 = GImGui;
  fVar51 = 0.0;
  if (((((uVar44 & 1) != 0) && (GImGui->NavMoveDir == -1)) &&
      (pIVar34 = GImGui->NavWindow, pIVar34 != (ImGuiWindow *)0x0)) &&
     ((((pIVar34->Flags & 0x40000) == 0 && (GImGui->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
      (uVar46 = (ulong)GImGui->NavLayer, uVar46 == 0)))) {
    local_40 = (long)(GImGui->IO).KeyMap[5];
    bVar47 = false;
    bVar26 = false;
    if ((-1 < local_40) && ((GImGui->IO).KeysDown[local_40] == true)) {
      bVar26 = (GImGui->ActiveIdUsingKeyInputMask & 0x20) == 0;
    }
    local_48 = (long)(GImGui->IO).KeyMap[6];
    if ((-1 < local_48) && ((GImGui->IO).KeysDown[local_48] == true)) {
      bVar47 = (GImGui->ActiveIdUsingKeyInputMask & 0x40) == 0;
    }
    local_38 = uVar46;
    bVar27 = IsKeyPressed((GImGui->IO).KeyMap[7],true);
    if (bVar27) {
      bVar27 = (pIVar33->ActiveIdUsingKeyInputMask & 0x80) == 0;
    }
    else {
      bVar27 = false;
    }
    bVar28 = IsKeyPressed((pIVar33->IO).KeyMap[8],true);
    uVar24 = local_38;
    if (bVar28) {
      uVar32 = (undefined4)
               CONCAT71((int7)(uVar46 >> 8),(pIVar33->ActiveIdUsingKeyInputMask & 0x100) == 0);
    }
    else {
      uVar32 = 0;
    }
    fVar51 = 0.0;
    if ((bVar26 != bVar47) || (bVar27 != SUB41(uVar32,0))) {
      if (((pIVar34->DC).NavLayerActiveMask == 0) && ((pIVar34->DC).NavHasScroll == true)) {
        bVar47 = IsKeyPressed((int)local_40,true);
        if (bVar47) {
          fVar51 = (pIVar34->Scroll).y - ((pIVar34->InnerRect).Max.y - (pIVar34->InnerRect).Min.y);
LAB_0011d6aa:
          (pIVar34->ScrollTarget).y = fVar51;
        }
        else {
          bVar47 = IsKeyPressed((int)local_48,true);
          if (bVar47) {
            fVar51 = ((pIVar34->InnerRect).Max.y - (pIVar34->InnerRect).Min.y) + (pIVar34->Scroll).y
            ;
            goto LAB_0011d6aa;
          }
          if (bVar27 == false) {
            if (SUB41(uVar32,0) == false) goto LAB_0011d6bd;
            fVar51 = (pIVar34->ScrollMax).y;
            goto LAB_0011d6aa;
          }
          (pIVar34->ScrollTarget).y = 0.0;
        }
        (pIVar34->ScrollTargetCenterRatio).y = 0.0;
        (pIVar34->ScrollTargetEdgeSnapDist).y = 0.0;
LAB_0011d6bd:
        fVar51 = 0.0;
      }
      else {
        pIVar35 = pIVar34->NavRectRel + local_38;
        fVar51 = pIVar33->FontBaseSize * pIVar34->FontWindowScale;
        if (pIVar34->ParentWindow != (ImGuiWindow *)0x0) {
          fVar51 = fVar51 * pIVar34->ParentWindow->FontWindowScale;
        }
        fVar51 = (pIVar34->NavRectRel[local_38].Max.y - pIVar34->NavRectRel[local_38].Min.y) +
                 (((pIVar34->InnerRect).Max.y - (pIVar34->InnerRect).Min.y) - fVar51);
        fVar51 = (float)(~-(uint)(fVar51 <= 0.0) & (uint)fVar51);
        local_4c = uVar32;
        bVar47 = IsKeyPressed((int)local_40,true);
        if (bVar47) {
          fVar51 = -fVar51;
          pIVar33->NavMoveDir = 3;
          pIVar33->NavMoveClipDir = 2;
          pIVar33->NavMoveRequestFlags = 0x30;
        }
        else {
          bVar47 = IsKeyPressed((int)local_48,true);
          if (!bVar47) {
            if (bVar27 == false) {
              fVar51 = 0.0;
              if ((char)local_4c != '\0') {
                fVar52 = ((pIVar34->ScrollMax).y + (pIVar34->SizeFull).y) - (pIVar34->Scroll).y;
                pIVar34->NavRectRel[uVar24].Max.y = fVar52;
                pIVar34->NavRectRel[uVar24].Min.y = fVar52;
                fVar52 = (pIVar35->Min).x;
                pIVar5 = &pIVar34->NavRectRel[uVar24].Max;
                if (pIVar5->x <= fVar52 && fVar52 != pIVar5->x) {
                  pIVar34->NavRectRel[uVar24].Max.x = 0.0;
                  (pIVar35->Min).x = 0.0;
                }
                pIVar33->NavMoveDir = 2;
                pIVar33->NavMoveRequestFlags = 0x50;
              }
              goto LAB_0011beb0;
            }
            fVar51 = -(pIVar34->Scroll).y;
            pIVar34->NavRectRel[uVar24].Max.y = fVar51;
            pIVar34->NavRectRel[uVar24].Min.y = fVar51;
            fVar51 = (pIVar35->Min).x;
            pIVar5 = &pIVar34->NavRectRel[uVar24].Max;
            if (pIVar5->x <= fVar51 && fVar51 != pIVar5->x) {
              pIVar34->NavRectRel[uVar24].Max.x = 0.0;
              (pIVar35->Min).x = 0.0;
            }
            pIVar33->NavMoveDir = 3;
            pIVar33->NavMoveRequestFlags = 0x50;
            goto LAB_0011d6bd;
          }
          pIVar33->NavMoveDir = 2;
          pIVar33->NavMoveClipDir = 3;
          pIVar33->NavMoveRequestFlags = 0x30;
        }
      }
    }
  }
LAB_0011beb0:
  uVar44 = pIVar22->NavMoveDir;
  if (uVar44 != 0xffffffff) {
    pIVar22->NavMoveRequest = true;
    pIVar22->NavMoveRequestKeyMods = (pIVar22->IO).KeyMods;
    pIVar22->NavMoveDirLast = uVar44;
  }
  bVar47 = pIVar22->NavMoveRequest;
  if (bVar47 == true && IVar8 == 0) {
    pIVar22->NavInitRequest = true;
    pIVar22->NavInitRequestFromMove = true;
    pIVar22->NavInitResultId = 0;
    pIVar22->NavDisableHighlight = false;
  }
  pIVar33 = GImGui;
  bVar26 = true;
  if (GImGui->NavMoveRequest == false) {
    bVar26 = GImGui->NavInitRequest;
  }
  GImGui->NavAnyRequest = bVar26;
  if (((pIVar30 != (ImGuiWindow *)0x0) && ((pIVar30->Flags & 0x40000) == 0)) &&
     (pIVar22->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    fVar52 = pIVar33->FontBaseSize * pIVar30->FontWindowScale;
    if (pIVar30->ParentWindow != (ImGuiWindow *)0x0) {
      fVar52 = fVar52 * pIVar30->ParentWindow->FontWindowScale;
    }
    fVar52 = (float)(int)(fVar52 * 100.0 * (pIVar22->IO).DeltaTime + 0.5);
    if (((pIVar30->DC).NavLayerActiveMask == 0) && (((pIVar30->DC).NavHasScroll & bVar47) == 1)) {
      if (uVar44 < 2) {
        (pIVar30->ScrollTarget).x =
             (float)(int)(*(float *)(&DAT_00167974 + (ulong)(uVar44 == 0) * 4) * fVar52 +
                         (pIVar30->Scroll).x);
        (pIVar30->ScrollTargetCenterRatio).x = 0.0;
        (pIVar30->ScrollTargetEdgeSnapDist).x = 0.0;
      }
      if ((uVar44 & 0xfffffffe) == 2) {
        (pIVar30->ScrollTarget).y =
             (float)(int)(*(float *)(&DAT_00167974 + (ulong)(uVar44 == 2) * 4) * fVar52 +
                         (pIVar30->Scroll).y);
        (pIVar30->ScrollTargetCenterRatio).y = 0.0;
        (pIVar30->ScrollTargetEdgeSnapDist).y = 0.0;
      }
    }
    IVar53 = GetNavInputAmount2d(4,ImGuiInputReadMode_Down,0.1,10.0);
    fVar65 = IVar53.x;
    fVar66 = IVar53.y;
    if (((fVar65 != 0.0) || (NAN(fVar65))) && (pIVar30->ScrollbarX == true)) {
      (pIVar30->ScrollTarget).x = (float)(int)(fVar65 * fVar52 + (pIVar30->Scroll).x);
      (pIVar30->ScrollTargetCenterRatio).x = 0.0;
      (pIVar30->ScrollTargetEdgeSnapDist).x = 0.0;
    }
    if ((fVar66 != 0.0) || (NAN(fVar66))) {
      (pIVar30->ScrollTarget).y = (float)(int)(fVar66 * fVar52 + (pIVar30->Scroll).y);
      (pIVar30->ScrollTargetCenterRatio).y = 0.0;
      (pIVar30->ScrollTargetEdgeSnapDist).y = 0.0;
    }
  }
  (pIVar22->NavMoveResultLocal).Window = (ImGuiWindow *)0x0;
  (pIVar22->NavMoveResultLocal).ID = 0;
  (pIVar22->NavMoveResultLocal).FocusScopeId = 0;
  (pIVar22->NavMoveResultLocal).DistAxial = 3.4028235e+38;
  (pIVar22->NavMoveResultLocal).DistBox = 3.4028235e+38;
  (pIVar22->NavMoveResultLocal).DistCenter = 3.4028235e+38;
  (pIVar22->NavMoveResultLocal).RectRel.Min.x = 0.0;
  (pIVar22->NavMoveResultLocal).RectRel.Min.y = 0.0;
  (pIVar22->NavMoveResultLocal).RectRel.Max.x = 0.0;
  (pIVar22->NavMoveResultLocal).RectRel.Max.y = 0.0;
  (pIVar22->NavMoveResultLocalVisibleSet).Window = (ImGuiWindow *)0x0;
  (pIVar22->NavMoveResultLocalVisibleSet).ID = 0;
  (pIVar22->NavMoveResultLocalVisibleSet).FocusScopeId = 0;
  (pIVar22->NavMoveResultLocalVisibleSet).DistAxial = 3.4028235e+38;
  (pIVar22->NavMoveResultLocalVisibleSet).DistBox = 3.4028235e+38;
  (pIVar22->NavMoveResultLocalVisibleSet).DistCenter = 3.4028235e+38;
  (pIVar22->NavMoveResultLocalVisibleSet).RectRel.Min.x = 0.0;
  (pIVar22->NavMoveResultLocalVisibleSet).RectRel.Min.y = 0.0;
  (pIVar22->NavMoveResultLocalVisibleSet).RectRel.Max.x = 0.0;
  (pIVar22->NavMoveResultLocalVisibleSet).RectRel.Max.y = 0.0;
  (pIVar22->NavMoveResultOther).Window = (ImGuiWindow *)0x0;
  (pIVar22->NavMoveResultOther).ID = 0;
  (pIVar22->NavMoveResultOther).FocusScopeId = 0;
  (pIVar22->NavMoveResultOther).DistAxial = 3.4028235e+38;
  (pIVar22->NavMoveResultOther).DistBox = 3.4028235e+38;
  (pIVar22->NavMoveResultOther).DistCenter = 3.4028235e+38;
  (pIVar22->NavMoveResultOther).RectRel.Min.x = 0.0;
  (pIVar22->NavMoveResultOther).RectRel.Min.y = 0.0;
  (pIVar22->NavMoveResultOther).RectRel.Max.x = 0.0;
  (pIVar22->NavMoveResultOther).RectRel.Max.y = 0.0;
  if (((bVar47 != false) && (pIVar22->NavInputSource == ImGuiInputSource_NavGamepad)) &&
     (pIVar22->NavLayer == ImGuiNavLayer_Main)) {
    IVar53 = (pIVar30->InnerRect).Min;
    fVar52 = (pIVar30->Pos).x;
    fVar65 = (pIVar30->Pos).y;
    IVar54 = (pIVar30->InnerRect).Max;
    local_68.Min.x = (IVar53.x - fVar52) + -1.0;
    local_68.Min.y = (IVar53.y - fVar65) + -1.0;
    local_68.Max.x = (IVar54.x - fVar52) + 1.0;
    local_68.Max.y = (IVar54.y - fVar65) + 1.0;
    if (((pIVar30->NavRectRel[0].Min.x < local_68.Min.x) ||
        (pIVar30->NavRectRel[0].Min.y < local_68.Min.y)) ||
       ((local_68.Max.x < pIVar30->NavRectRel[0].Max.x ||
        (local_68.Max.y < pIVar30->NavRectRel[0].Max.y)))) {
      fVar52 = pIVar33->FontBaseSize * pIVar30->FontWindowScale;
      if (pIVar30->ParentWindow != (ImGuiWindow *)0x0) {
        fVar52 = fVar52 * pIVar30->ParentWindow->FontWindowScale;
      }
      auVar58._0_4_ = fVar52 * 0.5;
      auVar62._0_4_ = local_68.Max.x - local_68.Min.x;
      auVar62._4_4_ = local_68.Max.y - local_68.Min.y;
      auVar62._8_8_ = 0;
      auVar58._4_4_ = auVar58._0_4_;
      auVar58._8_4_ = auVar58._0_4_;
      auVar58._12_4_ = auVar58._0_4_;
      auVar63 = minps(auVar62,auVar58);
      local_68.Min.y = auVar63._4_4_ + local_68.Min.y;
      local_68.Min.x = auVar63._0_4_ + local_68.Min.x;
      local_68.Max.y = local_68.Max.y - auVar63._4_4_;
      local_68.Max.x = local_68.Max.x - auVar63._0_4_;
      ImRect::ClipWithFull(pIVar30->NavRectRel,&local_68);
      pIVar22->NavId = 0;
      pIVar22->NavFocusScopeId = 0;
    }
  }
  pIVar30 = pIVar22->NavWindow;
  fVar60 = 0.0;
  fVar65 = 0.0;
  fVar52 = 0.0;
  fVar66 = 0.0;
  fVar71 = 0.0;
  if (pIVar30 != (ImGuiWindow *)0x0) {
    IVar38 = pIVar22->NavLayer;
    fVar52 = pIVar30->NavRectRel[IVar38].Min.x;
    fVar65 = pIVar30->NavRectRel[IVar38].Min.y;
    fVar66 = pIVar30->NavRectRel[IVar38].Max.x;
    fVar71 = pIVar30->NavRectRel[IVar38].Max.y;
  }
  fVar68 = 0.0;
  fVar67 = 0.0;
  fVar69 = 0.0;
  if (pIVar30 != (ImGuiWindow *)0x0) {
    fVar69 = (pIVar30->Pos).x;
    fVar67 = (pIVar30->Pos).y;
    fVar68 = fVar52 + fVar69;
    fVar60 = fVar65 + fVar67;
    fVar69 = fVar66 + fVar69;
    fVar67 = fVar71 + fVar67;
  }
  (pIVar22->NavScoringRect).Min.y = fVar60 + fVar51;
  (pIVar22->NavScoringRect).Max.y = fVar67 + fVar51;
  fVar51 = fVar68 + 1.0;
  if (fVar69 <= fVar68 + 1.0) {
    fVar51 = fVar69;
  }
  (pIVar22->NavScoringRect).Min.x = fVar51;
  (pIVar22->NavScoringRect).Max.x = fVar51;
  pIVar22->NavScoringCount = 0;
  pIVar22 = GImGui;
  IVar53 = (GImGui->IO).MousePos;
  fVar51 = IVar53.x;
  if ((-256000.0 <= fVar51) && (fVar52 = IVar53.y, -256000.0 <= fVar52)) {
    IVar54.x = (float)(int)fVar51;
    IVar54.y = (float)(int)fVar52;
    GImGui->LastValidMousePos = IVar54;
    (pIVar22->IO).MousePos = IVar54;
  }
  IVar53 = (pIVar22->IO).MousePos;
  fVar51 = IVar53.x;
  fVar52 = IVar53.y;
  if ((fVar51 < -256000.0) || (fVar52 < -256000.0)) {
LAB_0011c3b4:
    (pIVar22->IO).MouseDelta.x = 0.0;
    (pIVar22->IO).MouseDelta.y = 0.0;
  }
  else {
    IVar53 = (pIVar22->IO).MousePosPrev;
    fVar65 = IVar53.x;
    if ((fVar65 < -256000.0) || (fVar66 = IVar53.y, fVar66 < -256000.0)) goto LAB_0011c3b4;
    IVar19.y = fVar52 - fVar66;
    IVar19.x = fVar51 - fVar65;
    (pIVar22->IO).MouseDelta = IVar19;
  }
  if ((((pIVar22->IO).MouseDelta.x != 0.0) || (fVar51 = (pIVar22->IO).MouseDelta.y, fVar51 != 0.0))
     || (NAN(fVar51))) {
    pIVar22->NavDisableMouseHover = false;
  }
  IVar53 = (pIVar22->IO).MousePos;
  (pIVar22->IO).MousePosPrev = IVar53;
  lVar42 = -5;
  do {
    bVar47 = (pIVar22->IO).MouseDown[lVar42 + 5];
    if (bVar47 == true) {
      pfVar37 = (pIVar22->IO).MouseDownDurationPrev + lVar42;
      bVar26 = *pfVar37 <= 0.0 && *pfVar37 != 0.0;
    }
    else {
      bVar26 = false;
    }
    (pIVar22->IO).MouseDoubleClicked[lVar42] = bVar26;
    if (bVar47 == false) {
      bVar27 = 0.0 <= (pIVar22->IO).MouseDownDurationPrev[lVar42];
    }
    else {
      bVar27 = false;
    }
    (pIVar22->IO).MouseDownOwned[lVar42] = bVar27;
    fVar51 = (pIVar22->IO).MouseDownDurationPrev[lVar42];
    (&(pIVar22->IO).MouseDragMaxDistanceAbs[0].x)[lVar42] = fVar51;
    fVar65 = -1.0;
    if ((bVar47 != false) && (fVar65 = 0.0, 0.0 <= fVar51)) {
      fVar65 = fVar51 + (pIVar22->IO).DeltaTime;
    }
    (pIVar22->IO).MouseDownDurationPrev[lVar42] = fVar65;
    (pIVar22->IO).MouseReleased[lVar42] = false;
    if (bVar26 == false) {
      if (bVar47 != false) {
        fVar51 = (pIVar22->IO).MousePos.x;
        auVar70 = ZEXT816(0);
        if ((-256000.0 <= fVar51) && (-256000.0 <= fVar52)) {
          uVar7 = *(undefined8 *)((long)(pIVar22->IO).MouseClickedTime + lVar42 * 8 + -4);
          auVar70._0_4_ = fVar51 - (float)uVar7;
          auVar70._4_4_ = fVar52 - (float)((ulong)uVar7 >> 0x20);
          auVar70._8_8_ = 0;
        }
        fVar51 = (pIVar22->IO).KeysDownDuration[lVar42];
        fVar65 = auVar70._0_4_ * auVar70._0_4_ + auVar70._4_4_ * auVar70._4_4_;
        uVar44 = -(uint)(fVar65 <= fVar51);
        (pIVar22->IO).KeysDownDuration[lVar42] =
             (float)(~uVar44 & (uint)fVar65 | (uint)fVar51 & uVar44);
        uVar7 = *(undefined8 *)((pIVar22->IO).MouseDragMaxDistanceSqr + lVar42 * 2);
        fVar51 = (float)uVar7;
        fVar65 = (float)((ulong)uVar7 >> 0x20);
        auVar72._0_8_ = auVar70._0_8_ ^ 0x8000000080000000;
        auVar72._8_4_ = auVar70._8_4_ ^ 0x80000000;
        auVar72._12_4_ = auVar70._12_4_ ^ 0x80000000;
        auVar63 = maxps(auVar72,auVar70);
        uVar44 = -(uint)(auVar63._0_4_ <= fVar51);
        uVar48 = -(uint)(auVar63._4_4_ <= fVar65);
        *(ulong *)((pIVar22->IO).MouseDragMaxDistanceSqr + lVar42 * 2) =
             CONCAT44(~uVar48 & (uint)auVar63._4_4_,~uVar44 & (uint)auVar63._0_4_) |
             CONCAT44((uint)fVar65 & uVar48,(uint)fVar51 & uVar44);
      }
    }
    else {
      dVar6 = pIVar22->Time;
      fVar51 = (pIVar22->IO).MouseDoubleClickTime;
      if ((float)(dVar6 - *(double *)((pIVar22->IO).MouseClicked + lVar42 * 8)) < fVar51) {
        fVar65 = (pIVar22->IO).MousePos.x;
        fVar66 = 0.0;
        fVar71 = 0.0;
        if ((-256000.0 <= fVar65) && (-256000.0 <= fVar52)) {
          uVar7 = *(undefined8 *)((long)(pIVar22->IO).MouseClickedTime + lVar42 * 8 + -4);
          fVar66 = fVar65 - (float)uVar7;
          fVar71 = fVar52 - (float)((ulong)uVar7 >> 0x20);
        }
        fVar65 = (pIVar22->IO).MouseDoubleClickMaxDist;
        if (fVar66 * fVar66 + fVar71 * fVar71 < fVar65 * fVar65) {
          (pIVar22->IO).MouseReleased[lVar42] = true;
        }
        dVar6 = (double)(fVar51 * -2.0);
      }
      *(double *)((pIVar22->IO).MouseClicked + lVar42 * 8) = dVar6;
      *(ImVec2 *)((long)(pIVar22->IO).MouseClickedTime + lVar42 * 8 + -4) = IVar53;
      *(bool *)((long)(pIVar22->IO).MouseDownDuration + lVar42 + -3) =
           (pIVar22->IO).MouseReleased[lVar42];
      pfVar37 = (pIVar22->IO).MouseDragMaxDistanceSqr + lVar42 * 2;
      pfVar37[0] = 0.0;
      pfVar37[1] = 0.0;
      (pIVar22->IO).KeysDownDuration[lVar42] = 0.0;
    }
    if (((pIVar22->IO).MouseDown[lVar42 + 5] == false) &&
       ((pIVar22->IO).MouseDownOwned[lVar42] == false)) {
      *(undefined1 *)((long)(pIVar22->IO).MouseDownDuration + lVar42 + -3) = 0;
    }
    if ((pIVar22->IO).MouseDoubleClicked[lVar42] == true) {
      pIVar22->NavDisableMouseHover = false;
    }
    lVar42 = lVar42 + 1;
  } while (lVar42 != 0);
  UpdateHoveredWindowAndCaptureFlags();
  UpdateMouseMovingWindowNewFrame();
  pIVar30 = GetTopMostPopupModal();
  if ((pIVar30 != (ImGuiWindow *)0x0) ||
     ((pIVar21->NavWindowingTarget != (ImGuiWindow *)0x0 &&
      (0.0 < pIVar21->NavWindowingHighlightAlpha)))) {
    fVar51 = (pIVar21->IO).DeltaTime * 6.0 + pIVar21->DimBgRatio;
    if (1.0 <= fVar51) {
      fVar51 = 1.0;
    }
    pIVar21->DimBgRatio = fVar51;
  }
  else {
    fVar51 = (pIVar21->IO).DeltaTime * -10.0 + pIVar21->DimBgRatio;
    pIVar21->DimBgRatio = (float)(-(uint)(0.0 <= fVar51) & (uint)fVar51);
  }
  pIVar21->MouseCursor = 0;
  pIVar21->WantTextInputNextFrame = -1;
  pIVar21->WantCaptureMouseNextFrame = -1;
  pIVar21->WantCaptureKeyboardNextFrame = -1;
  (pIVar21->PlatformImePos).x = 1.0;
  pIVar22 = GImGui;
  (pIVar21->PlatformImePos).y = 1.0;
  if (GImGui->WheelingWindow != (ImGuiWindow *)0x0) {
    GImGui->WheelingWindowTimer = GImGui->WheelingWindowTimer - (GImGui->IO).DeltaTime;
    fVar51 = (pIVar22->IO).MousePos.x;
    if (((-256000.0 <= fVar51) && (fVar52 = (pIVar22->IO).MousePos.y, -256000.0 <= fVar52)) &&
       (fVar51 = fVar51 - (pIVar22->WheelingWindowRefMousePos).x,
       fVar52 = fVar52 - (pIVar22->WheelingWindowRefMousePos).y,
       fVar65 = (pIVar22->IO).MouseDragThreshold,
       fVar65 * fVar65 < fVar51 * fVar51 + fVar52 * fVar52)) {
      pIVar22->WheelingWindowTimer = 0.0;
    }
    if (pIVar22->WheelingWindowTimer <= 0.0) {
      pIVar22->WheelingWindow = (ImGuiWindow *)0x0;
      pIVar22->WheelingWindowTimer = 0.0;
    }
  }
  fVar51 = (pIVar22->IO).MouseWheel;
  if (((((fVar51 != 0.0) || (fVar52 = (pIVar22->IO).MouseWheelH, fVar52 != 0.0)) || (NAN(fVar52)))
      && ((pIVar22->ActiveId == 0 || (pIVar22->ActiveIdUsingMouseWheel == false)))) &&
     ((pIVar22->HoveredIdPreviousFrame == 0 ||
      (pIVar22->HoveredIdPreviousFrameUsingMouseWheel == false)))) {
    pIVar30 = pIVar22->WheelingWindow;
    pIVar34 = pIVar30;
    if (pIVar30 == (ImGuiWindow *)0x0) {
      pIVar34 = pIVar22->HoveredWindow;
    }
    if ((pIVar34 != (ImGuiWindow *)0x0) && (pIVar34->Collapsed == false)) {
      fVar52 = 0.0;
      if ((fVar51 != 0.0) || (NAN(fVar51))) {
        if (((pIVar22->IO).KeyCtrl == true) && ((pIVar22->IO).FontAllowUserScaling == true)) {
          if (pIVar30 != pIVar34) {
            pIVar22->WheelingWindow = pIVar34;
            pIVar22->WheelingWindowRefMousePos = (pIVar22->IO).MousePos;
            pIVar22->WheelingWindowTimer = 2.0;
          }
          fVar51 = pIVar34->FontWindowScale;
          fVar65 = (pIVar22->IO).MouseWheel * 0.1 + fVar51;
          fVar52 = 2.5;
          if (fVar65 <= 2.5) {
            fVar52 = fVar65;
          }
          fVar52 = (float)(-(uint)(fVar65 < 0.5) & 0x3f000000 |
                          ~-(uint)(fVar65 < 0.5) & (uint)fVar52);
          pIVar34->FontWindowScale = fVar52;
          if ((pIVar34->Flags & 0x1000000) == 0) {
            fVar52 = fVar52 / fVar51;
            IVar53 = pIVar34->Size;
            auVar59._8_8_ = 0;
            auVar59._0_4_ = IVar53.x;
            auVar59._4_4_ = IVar53.y;
            IVar54 = (pIVar22->IO).MousePos;
            fVar51 = (pIVar34->Pos).x;
            fVar65 = (pIVar34->Pos).y;
            auVar64._0_4_ = (IVar54.x - fVar51) * (1.0 - fVar52) * IVar53.x;
            auVar64._4_4_ = (IVar54.y - fVar65) * (1.0 - fVar52) * IVar53.y;
            auVar64._8_8_ = 0;
            auVar63 = divps(auVar64,auVar59);
            local_68.Min.x = auVar63._0_4_ + fVar51;
            local_68.Min.y = auVar63._4_4_ + fVar65;
            SetWindowPos(pIVar34,&local_68.Min,0);
            IVar53 = pIVar34->SizeFull;
            IVar55.x = (float)(int)((pIVar34->Size).x * fVar52);
            IVar55.y = (float)(int)((pIVar34->Size).y * fVar52);
            pIVar34->Size = IVar55;
            (pIVar34->SizeFull).x = (float)(int)(IVar53.x * fVar52);
            (pIVar34->SizeFull).y = (float)(int)(IVar53.y * fVar52);
          }
          goto LAB_0011cc68;
        }
        if ((pIVar22->IO).KeyShift == false) {
          fVar52 = fVar51;
        }
      }
      if (((fVar52 != 0.0) || (NAN(fVar52))) && ((pIVar22->IO).KeyCtrl == false)) {
        if (pIVar30 != pIVar34) {
          pIVar22->WheelingWindow = pIVar34;
          pIVar22->WheelingWindowRefMousePos = (pIVar22->IO).MousePos;
          pIVar22->WheelingWindowTimer = 2.0;
        }
        uVar44 = pIVar34->Flags;
        while (((uVar44 >> 0x18 & 1) != 0 &&
               (((uVar44 & 0x210) == 0x10 ||
                ((fVar51 = (pIVar34->ScrollMax).y, fVar51 == 0.0 && (!NAN(fVar51)))))))) {
          pIVar34 = pIVar34->ParentWindow;
          uVar44 = pIVar34->Flags;
        }
        if ((uVar44 & 0x210) == 0) {
          fVar51 = ((pIVar34->InnerRect).Max.y - (pIVar34->InnerRect).Min.y) * 0.67;
          fVar65 = pIVar22->FontBaseSize * pIVar34->FontWindowScale;
          if (pIVar34->ParentWindow != (ImGuiWindow *)0x0) {
            fVar65 = fVar65 * pIVar34->ParentWindow->FontWindowScale;
          }
          fVar66 = fVar65 * 5.0;
          if (fVar51 <= fVar65 * 5.0) {
            fVar66 = fVar51;
          }
          (pIVar34->ScrollTarget).y = (pIVar34->Scroll).y - fVar52 * (float)(int)fVar66;
          (pIVar34->ScrollTargetCenterRatio).y = 0.0;
          (pIVar34->ScrollTargetEdgeSnapDist).y = 0.0;
        }
      }
      fVar51 = (pIVar22->IO).MouseWheelH;
      if (((fVar51 == 0.0) && (!NAN(fVar51))) || ((pIVar22->IO).KeyShift == true)) {
        fVar52 = (pIVar22->IO).MouseWheel;
        if ((fVar52 != 0.0) || (NAN(fVar52))) {
          fVar51 = 0.0;
          if ((pIVar22->IO).KeyShift == true) {
            fVar51 = fVar52;
          }
        }
        else {
          fVar51 = 0.0;
        }
      }
      if (((fVar51 != 0.0) || (NAN(fVar51))) && ((pIVar22->IO).KeyCtrl == false)) {
        if (pIVar22->WheelingWindow != pIVar34) {
          pIVar22->WheelingWindow = pIVar34;
          pIVar22->WheelingWindowRefMousePos = (pIVar22->IO).MousePos;
          pIVar22->WheelingWindowTimer = 2.0;
        }
        while ((uVar44 = pIVar34->Flags, (uVar44 >> 0x18 & 1) != 0 &&
               (((uVar44 & 0x210) == 0x10 ||
                ((fVar52 = (pIVar34->ScrollMax).x, fVar52 == 0.0 && (!NAN(fVar52)))))))) {
          pIVar34 = pIVar34->ParentWindow;
        }
        if ((uVar44 & 0x210) == 0) {
          fVar52 = ((pIVar34->InnerRect).Max.x - (pIVar34->InnerRect).Min.x) * 0.67;
          fVar65 = pIVar22->FontBaseSize * pIVar34->FontWindowScale;
          if (pIVar34->ParentWindow != (ImGuiWindow *)0x0) {
            fVar65 = fVar65 * pIVar34->ParentWindow->FontWindowScale;
          }
          fVar66 = fVar65 + fVar65;
          if (fVar52 <= fVar65 + fVar65) {
            fVar66 = fVar52;
          }
          (pIVar34->ScrollTarget).x = (pIVar34->Scroll).x - fVar51 * (float)(int)fVar66;
          (pIVar34->ScrollTargetCenterRatio).x = 0.0;
          (pIVar34->ScrollTargetEdgeSnapDist).x = 0.0;
        }
      }
    }
  }
LAB_0011cc68:
  pIVar22 = GImGui;
  pIVar30 = GImGui->NavWindow;
  if (((pIVar30 == (ImGuiWindow *)0x0) || (pIVar30->Active != true)) ||
     (((pIVar30->Flags & 0x40000) != 0 ||
      (((GImGui->IO).KeyCtrl != false || (iVar36 = (GImGui->IO).KeyMap[0], iVar36 < 0)))))) {
    bVar47 = false;
  }
  else {
    bVar47 = IsKeyPressed(iVar36,true);
  }
  pIVar22->FocusTabPressed = bVar47;
  if ((bVar47 != false) && (pIVar22->ActiveId == 0)) {
    pIVar22->FocusRequestNextWindow = pIVar30;
    pIVar22->FocusRequestNextCounterRegular = 0x7fffffff;
    if ((pIVar22->NavId == 0) || (pIVar22->NavIdTabCounter == 0x7fffffff)) {
      iVar36 = -(uint)(pIVar22->IO).KeyShift;
    }
    else {
      iVar36 = pIVar22->NavIdTabCounter + (-(uint)(pIVar22->IO).KeyShift | 1) + 1;
    }
    pIVar22->FocusRequestNextCounterTabStop = iVar36;
  }
  pIVar22->FocusRequestCurrWindow = (ImGuiWindow *)0x0;
  pIVar22->FocusRequestCurrCounterRegular = 0x7fffffff;
  pIVar22->FocusRequestCurrCounterTabStop = 0x7fffffff;
  pIVar30 = pIVar22->FocusRequestNextWindow;
  if (pIVar30 != (ImGuiWindow *)0x0) {
    pIVar22->FocusRequestCurrWindow = pIVar30;
    if ((pIVar22->FocusRequestNextCounterRegular != 0x7fffffff) &&
       (iVar36 = (pIVar30->DC).FocusCounterRegular, iVar36 != -1)) {
      pIVar22->FocusRequestCurrCounterRegular =
           (pIVar22->FocusRequestNextCounterRegular + iVar36 + 1) % (iVar36 + 1);
    }
    if ((pIVar22->FocusRequestNextCounterTabStop != 0x7fffffff) &&
       (iVar36 = (pIVar30->DC).FocusCounterTabStop, iVar36 != -1)) {
      pIVar22->FocusRequestCurrCounterTabStop =
           (pIVar22->FocusRequestNextCounterTabStop + iVar36 + 1) % (iVar36 + 1);
    }
    pIVar22->FocusRequestNextWindow = (ImGuiWindow *)0x0;
    pIVar22->FocusRequestNextCounterRegular = 0x7fffffff;
    pIVar22->FocusRequestNextCounterTabStop = 0x7fffffff;
  }
  pIVar22->NavIdTabCounter = 0x7fffffff;
  fVar51 = 3.4028235e+38;
  if ((pIVar21->GcCompactAll == false) &&
     (fVar52 = (pIVar21->IO).ConfigMemoryCompactTimer, 0.0 <= fVar52)) {
    fVar51 = (float)pIVar21->Time - fVar52;
  }
  if ((pIVar21->Windows).Size != 0) {
    uVar46 = 0;
    do {
      pIVar30 = (pIVar21->Windows).Data[uVar46];
      bVar47 = pIVar30->Active;
      pIVar30->WasActive = bVar47;
      pIVar30->BeginCount = 0;
      pIVar30->Active = false;
      pIVar30->WriteAccessed = false;
      if (((bVar47 == false) && (pIVar30->MemoryCompacted == false)) &&
         (pIVar30->LastTimeActive <= fVar51 && fVar51 != pIVar30->LastTimeActive)) {
        GcCompactTransientWindowBuffers(pIVar30);
      }
      uVar46 = uVar46 + 1;
    } while (uVar46 != (uint)(pIVar21->Windows).Size);
  }
  if (0 < (pIVar21->TablesLastTimeActive).Size) {
    lVar42 = 0;
    lVar40 = 0;
    do {
      fVar52 = (pIVar21->TablesLastTimeActive).Data[lVar40];
      if ((0.0 <= fVar52) && (fVar52 < fVar51)) {
        TableGcCompactTransientBuffers
                  ((ImGuiTable *)((long)&((pIVar21->Tables).Buf.Data)->ID + lVar42));
      }
      lVar40 = lVar40 + 1;
      lVar42 = lVar42 + 600;
    } while (lVar40 < (pIVar21->TablesLastTimeActive).Size);
  }
  if (pIVar21->GcCompactAll != false) {
    GcCompactTransientMiscBuffers();
  }
  pIVar21->GcCompactAll = false;
  if ((pIVar21->NavWindow != (ImGuiWindow *)0x0) && (pIVar21->NavWindow->WasActive == false)) {
    FocusTopMostWindowUnderOne((ImGuiWindow *)0x0,(ImGuiWindow *)0x0);
  }
  iVar36 = (pIVar21->CurrentWindowStack).Capacity;
  if (iVar36 < 0) {
    uVar44 = iVar36 / 2 + iVar36;
    uVar46 = 0;
    if (0 < (int)uVar44) {
      uVar46 = (ulong)uVar44;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar17 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar17 = *piVar17 + 1;
    }
    __dest_00 = (ImGuiWindow **)(*GImAllocatorAllocFunc)(uVar46 * 8,GImAllocatorUserData);
    ppIVar15 = (pIVar21->CurrentWindowStack).Data;
    if (ppIVar15 != (ImGuiWindow **)0x0) {
      memcpy(__dest_00,ppIVar15,(long)(pIVar21->CurrentWindowStack).Size << 3);
      ppIVar15 = (pIVar21->CurrentWindowStack).Data;
      if ((ppIVar15 != (ImGuiWindow **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar17 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar17 = *piVar17 + -1;
      }
      (*GImAllocatorFreeFunc)(ppIVar15,GImAllocatorUserData);
    }
    (pIVar21->CurrentWindowStack).Data = __dest_00;
    (pIVar21->CurrentWindowStack).Capacity = (int)uVar46;
  }
  (pIVar21->CurrentWindowStack).Size = 0;
  iVar36 = (pIVar21->BeginPopupStack).Capacity;
  if (iVar36 < 0) {
    uVar44 = iVar36 / 2 + iVar36;
    uVar46 = 0;
    if (0 < (int)uVar44) {
      uVar46 = (ulong)uVar44;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar17 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar17 = *piVar17 + 1;
    }
    __dest_01 = (ImGuiPopupData *)(*GImAllocatorAllocFunc)(uVar46 * 0x30,GImAllocatorUserData);
    pIVar16 = (pIVar21->BeginPopupStack).Data;
    if (pIVar16 != (ImGuiPopupData *)0x0) {
      memcpy(__dest_01,pIVar16,(long)(pIVar21->BeginPopupStack).Size * 0x30);
      pIVar16 = (pIVar21->BeginPopupStack).Data;
      if ((pIVar16 != (ImGuiPopupData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar17 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar17 = *piVar17 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar16,GImAllocatorUserData);
    }
    (pIVar21->BeginPopupStack).Data = __dest_01;
    (pIVar21->BeginPopupStack).Capacity = (int)uVar46;
  }
  (pIVar21->BeginPopupStack).Size = 0;
  iVar36 = (pIVar21->ItemFlagsStack).Capacity;
  if (iVar36 < 0) {
    uVar44 = iVar36 / 2 + iVar36;
    uVar46 = 0;
    if (0 < (int)uVar44) {
      uVar46 = (ulong)uVar44;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar17 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar17 = *piVar17 + 1;
    }
    piVar31 = (int *)(*GImAllocatorAllocFunc)(uVar46 * 4,GImAllocatorUserData);
    piVar17 = (pIVar21->ItemFlagsStack).Data;
    if (piVar17 != (int *)0x0) {
      memcpy(piVar31,piVar17,(long)(pIVar21->ItemFlagsStack).Size << 2);
      piVar17 = (pIVar21->ItemFlagsStack).Data;
      if ((piVar17 != (int *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar4 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar4 = *piVar4 + -1;
      }
      (*GImAllocatorFreeFunc)(piVar17,GImAllocatorUserData);
    }
    (pIVar21->ItemFlagsStack).Data = piVar31;
    (pIVar21->ItemFlagsStack).Capacity = (int)uVar46;
  }
  (pIVar21->ItemFlagsStack).Size = 0;
  if ((pIVar21->ItemFlagsStack).Capacity == 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar17 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar17 = *piVar17 + 1;
    }
    piVar31 = (int *)(*GImAllocatorAllocFunc)(0x20,GImAllocatorUserData);
    piVar17 = (pIVar21->ItemFlagsStack).Data;
    if (piVar17 != (int *)0x0) {
      memcpy(piVar31,piVar17,(long)(pIVar21->ItemFlagsStack).Size << 2);
      piVar17 = (pIVar21->ItemFlagsStack).Data;
      if ((piVar17 != (int *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar4 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar4 = *piVar4 + -1;
      }
      (*GImAllocatorFreeFunc)(piVar17,GImAllocatorUserData);
    }
    (pIVar21->ItemFlagsStack).Data = piVar31;
    (pIVar21->ItemFlagsStack).Capacity = 8;
  }
  (pIVar21->ItemFlagsStack).Data[(pIVar21->ItemFlagsStack).Size] = 0;
  (pIVar21->ItemFlagsStack).Size = (pIVar21->ItemFlagsStack).Size + 1;
  iVar36 = (pIVar21->GroupStack).Capacity;
  if (iVar36 < 0) {
    uVar44 = iVar36 / 2 + iVar36;
    uVar46 = 0;
    if (0 < (int)uVar44) {
      uVar46 = (ulong)uVar44;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar17 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar17 = *piVar17 + 1;
    }
    __dest_02 = (ImGuiGroupData *)(*GImAllocatorAllocFunc)(uVar46 * 0x30,GImAllocatorUserData);
    pIVar18 = (pIVar21->GroupStack).Data;
    if (pIVar18 != (ImGuiGroupData *)0x0) {
      memcpy(__dest_02,pIVar18,(long)(pIVar21->GroupStack).Size * 0x30);
      pIVar18 = (pIVar21->GroupStack).Data;
      if ((pIVar18 != (ImGuiGroupData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar17 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar17 = *piVar17 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar18,GImAllocatorUserData);
    }
    (pIVar21->GroupStack).Data = __dest_02;
    (pIVar21->GroupStack).Capacity = (int)uVar46;
  }
  (pIVar21->GroupStack).Size = 0;
  ClosePopupsOverWindow(pIVar21->NavWindow,false);
  pIVar22 = GImGui;
  GImGui->DebugItemPickerBreakId = 0;
  if (pIVar22->DebugItemPickerActive == true) {
    uVar44 = pIVar22->HoveredIdPreviousFrame;
    pIVar22->MouseCursor = 7;
    iVar36 = (pIVar22->IO).KeyMap[0xe];
    if ((-1 < iVar36) && (bVar47 = IsKeyPressed(iVar36,true), bVar47)) {
      pIVar22->DebugItemPickerActive = false;
    }
    if (uVar44 != 0 && (pIVar22->IO).MouseDownDuration[0] == 0.0) {
      pIVar22->DebugItemPickerBreakId = uVar44;
      pIVar22->DebugItemPickerActive = false;
    }
    *(byte *)&(pIVar22->NextWindowData).Flags = (byte)(pIVar22->NextWindowData).Flags | 0x40;
    (pIVar22->NextWindowData).BgAlphaVal = 0.6;
    BeginTooltipEx(0,0);
    Text("HoveredId: 0x%08X",(ulong)uVar44);
    Text("Press ESC to abort picking.");
    TextColored((GImGui->Style).Colors + (uVar44 == 0),"Click to break in debugger!");
    End();
  }
  pIVar21->WithinFrameScopeWithImplicitWindow = true;
  pIVar22 = GImGui;
  (GImGui->NextWindowData).Flags = (GImGui->NextWindowData).Flags | 2;
  (pIVar22->NextWindowData).SizeVal.x = 400.0;
  (pIVar22->NextWindowData).SizeVal.y = 400.0;
  (pIVar22->NextWindowData).SizeCond = 4;
  Begin("Debug##Default",(bool *)0x0,0);
  if (0 < (pIVar21->Hooks).Size) {
    lVar42 = 0;
    lVar40 = 0;
    do {
      pIVar11 = (pIVar21->Hooks).Data;
      if (*(int *)(pIVar11 + lVar42 + 4) == 1) {
        (**(code **)(pIVar11 + lVar42 + 0x10))(pIVar21,pIVar11 + lVar42);
      }
      lVar40 = lVar40 + 1;
      lVar42 = lVar42 + 0x20;
    } while (lVar40 < (pIVar21->Hooks).Size);
  }
  return;
}

Assistant:

void ImGui::NewFrame()
{
    IM_ASSERT(GImGui != NULL && "No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?");
    ImGuiContext& g = *GImGui;
    
    // Remove pending delete hooks before frame start.
    // This deferred removal avoid issues of removal while iterating the hook vector
    for (int n = g.Hooks.Size - 1; n >= 0; n--)
        if (g.Hooks[n].Type == ImGuiContextHookType_PendingRemoval_)
            g.Hooks.erase(&g.Hooks[n]);

    CallContextHooks(&g, ImGuiContextHookType_NewFramePre);

    // Check and assert for various common IO and Configuration mistakes
    ErrorCheckNewFrameSanityChecks();

    // Load settings on first frame, save settings when modified (after a delay)
    UpdateSettings();

    g.Time += g.IO.DeltaTime;
    g.WithinFrameScope = true;
    g.FrameCount += 1;
    g.TooltipOverrideCount = 0;
    g.WindowsActiveCount = 0;
    g.MenusIdSubmittedThisFrame.resize(0);

    // Calculate frame-rate for the user, as a purely luxurious feature
    g.FramerateSecPerFrameAccum += g.IO.DeltaTime - g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx];
    g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx] = g.IO.DeltaTime;
    g.FramerateSecPerFrameIdx = (g.FramerateSecPerFrameIdx + 1) % IM_ARRAYSIZE(g.FramerateSecPerFrame);
    g.IO.Framerate = (g.FramerateSecPerFrameAccum > 0.0f) ? (1.0f / (g.FramerateSecPerFrameAccum / (float)IM_ARRAYSIZE(g.FramerateSecPerFrame))) : FLT_MAX;

    UpdateViewportsNewFrame();

    // Setup current font and draw list shared data
    g.IO.Fonts->Locked = true;
    SetCurrentFont(GetDefaultFont());
    IM_ASSERT(g.Font->IsLoaded());
    ImRect virtual_space(FLT_MAX, FLT_MAX, -FLT_MAX, -FLT_MAX);
    for (int n = 0; n < g.Viewports.Size; n++)
        virtual_space.Add(g.Viewports[n]->GetMainRect());
    g.DrawListSharedData.ClipRectFullscreen = virtual_space.ToVec4();
    g.DrawListSharedData.CurveTessellationTol = g.Style.CurveTessellationTol;
    g.DrawListSharedData.SetCircleSegmentMaxError(g.Style.CircleSegmentMaxError);
    g.DrawListSharedData.InitialFlags = ImDrawListFlags_None;
    if (g.Style.AntiAliasedLines)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLines;
    if (g.Style.AntiAliasedLinesUseTex && !(g.Font->ContainerAtlas->Flags & ImFontAtlasFlags_NoBakedLines))
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLinesUseTex;
    if (g.Style.AntiAliasedFill)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedFill;
    if (g.IO.BackendFlags & ImGuiBackendFlags_RendererHasVtxOffset)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AllowVtxOffset;

    // Mark rendering data as invalid to prevent user who may have a handle on it to use it.
    for (int n = 0; n < g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawDataP.Clear();
    }

    // Drag and drop keep the source ID alive so even if the source disappear our state is consistent
    if (g.DragDropActive && g.DragDropPayload.SourceId == g.ActiveId)
        KeepAliveID(g.DragDropPayload.SourceId);

    // Update HoveredId data
    if (!g.HoveredIdPreviousFrame)
        g.HoveredIdTimer = 0.0f;
    if (!g.HoveredIdPreviousFrame || (g.HoveredId && g.ActiveId == g.HoveredId))
        g.HoveredIdNotActiveTimer = 0.0f;
    if (g.HoveredId)
        g.HoveredIdTimer += g.IO.DeltaTime;
    if (g.HoveredId && g.ActiveId != g.HoveredId)
        g.HoveredIdNotActiveTimer += g.IO.DeltaTime;
    g.HoveredIdPreviousFrame = g.HoveredId;
    g.HoveredIdPreviousFrameUsingMouseWheel = g.HoveredIdUsingMouseWheel;
    g.HoveredId = 0;
    g.HoveredIdAllowOverlap = false;
    g.HoveredIdUsingMouseWheel = false;
    g.HoveredIdDisabled = false;

    // Update ActiveId data (clear reference to active widget if the widget isn't alive anymore)
    if (g.ActiveIdIsAlive != g.ActiveId && g.ActiveIdPreviousFrame == g.ActiveId && g.ActiveId != 0)
        ClearActiveID();
    if (g.ActiveId)
        g.ActiveIdTimer += g.IO.DeltaTime;
    g.LastActiveIdTimer += g.IO.DeltaTime;
    g.ActiveIdPreviousFrame = g.ActiveId;
    g.ActiveIdPreviousFrameWindow = g.ActiveIdWindow;
    g.ActiveIdPreviousFrameHasBeenEditedBefore = g.ActiveIdHasBeenEditedBefore;
    g.ActiveIdIsAlive = 0;
    g.ActiveIdHasBeenEditedThisFrame = false;
    g.ActiveIdPreviousFrameIsAlive = false;
    g.ActiveIdIsJustActivated = false;
    if (g.TempInputId != 0 && g.ActiveId != g.TempInputId)
        g.TempInputId = 0;
    if (g.ActiveId == 0)
    {
        g.ActiveIdUsingNavDirMask = 0x00;
        g.ActiveIdUsingNavInputMask = 0x00;
        g.ActiveIdUsingKeyInputMask = 0x00;
    }

    // Drag and drop
    g.DragDropAcceptIdPrev = g.DragDropAcceptIdCurr;
    g.DragDropAcceptIdCurr = 0;
    g.DragDropAcceptIdCurrRectSurface = FLT_MAX;
    g.DragDropWithinSource = false;
    g.DragDropWithinTarget = false;
    g.DragDropHoldJustPressedId = 0;

    // Update keyboard input state
    // Synchronize io.KeyMods with individual modifiers io.KeyXXX bools
    g.IO.KeyMods = GetMergedKeyModFlags();
    memcpy(g.IO.KeysDownDurationPrev, g.IO.KeysDownDuration, sizeof(g.IO.KeysDownDuration));
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.KeysDown); i++)
        g.IO.KeysDownDuration[i] = g.IO.KeysDown[i] ? (g.IO.KeysDownDuration[i] < 0.0f ? 0.0f : g.IO.KeysDownDuration[i] + g.IO.DeltaTime) : -1.0f;

    // Update gamepad/keyboard navigation
    NavUpdate();

    // Update mouse input state
    UpdateMouseInputs();

    // Find hovered window
    // (needs to be before UpdateMouseMovingWindowNewFrame so we fill g.HoveredWindowUnderMovingWindow on the mouse release frame)
    UpdateHoveredWindowAndCaptureFlags();

    // Handle user moving window with mouse (at the beginning of the frame to avoid input lag or sheering)
    UpdateMouseMovingWindowNewFrame();

    // Background darkening/whitening
    if (GetTopMostPopupModal() != NULL || (g.NavWindowingTarget != NULL && g.NavWindowingHighlightAlpha > 0.0f))
        g.DimBgRatio = ImMin(g.DimBgRatio + g.IO.DeltaTime * 6.0f, 1.0f);
    else
        g.DimBgRatio = ImMax(g.DimBgRatio - g.IO.DeltaTime * 10.0f, 0.0f);

    g.MouseCursor = ImGuiMouseCursor_Arrow;
    g.WantCaptureMouseNextFrame = g.WantCaptureKeyboardNextFrame = g.WantTextInputNextFrame = -1;
    g.PlatformImePos = ImVec2(1.0f, 1.0f); // OS Input Method Editor showing on top-left of our window by default

    // Mouse wheel scrolling, scale
    UpdateMouseWheel();

    // Update legacy TAB focus
    UpdateTabFocus();

    // Mark all windows as not visible and compact unused memory.
    IM_ASSERT(g.WindowsFocusOrder.Size == g.Windows.Size);
    const float memory_compact_start_time = (g.GcCompactAll || g.IO.ConfigMemoryCompactTimer < 0.0f) ? FLT_MAX : (float)g.Time - g.IO.ConfigMemoryCompactTimer;
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        window->WasActive = window->Active;
        window->BeginCount = 0;
        window->Active = false;
        window->WriteAccessed = false;

        // Garbage collect transient buffers of recently unused windows
        if (!window->WasActive && !window->MemoryCompacted && window->LastTimeActive < memory_compact_start_time)
            GcCompactTransientWindowBuffers(window);
    }

    // Garbage collect transient buffers of recently unused tables
    for (int i = 0; i < g.TablesLastTimeActive.Size; i++)
        if (g.TablesLastTimeActive[i] >= 0.0f && g.TablesLastTimeActive[i] < memory_compact_start_time)
            TableGcCompactTransientBuffers(g.Tables.GetByIndex(i));
    if (g.GcCompactAll)
        GcCompactTransientMiscBuffers();
    g.GcCompactAll = false;

    // Closing the focused window restore focus to the first active root window in descending z-order
    if (g.NavWindow && !g.NavWindow->WasActive)
        FocusTopMostWindowUnderOne(NULL, NULL);

    // No window should be open at the beginning of the frame.
    // But in order to allow the user to call NewFrame() multiple times without calling Render(), we are doing an explicit clear.
    g.CurrentWindowStack.resize(0);
    g.BeginPopupStack.resize(0);
    g.ItemFlagsStack.resize(0);
    g.ItemFlagsStack.push_back(ImGuiItemFlags_Default_);
    g.GroupStack.resize(0);
    ClosePopupsOverWindow(g.NavWindow, false);

    // [DEBUG] Item picker tool - start with DebugStartItemPicker() - useful to visually select an item and break into its call-stack.
    UpdateDebugToolItemPicker();

    // Create implicit/fallback window - which we will only render it if the user has added something to it.
    // We don't use "Debug" to avoid colliding with user trying to create a "Debug" window with custom flags.
    // This fallback is particularly important as it avoid ImGui:: calls from crashing.
    g.WithinFrameScopeWithImplicitWindow = true;
    SetNextWindowSize(ImVec2(400, 400), ImGuiCond_FirstUseEver);
    Begin("Debug##Default");
    IM_ASSERT(g.CurrentWindow->IsFallbackWindow == true);

    CallContextHooks(&g, ImGuiContextHookType_NewFramePost);
}